

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_t<embree::sse2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  int iVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined6 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  RTCFilterFunctionN *pp_Var52;
  int iVar53;
  ulong uVar54;
  ulong uVar55;
  undefined4 uVar56;
  ulong uVar57;
  RTCIntersectArguments *pRVar58;
  RTCIntersectArguments *pRVar59;
  undefined1 *puVar60;
  undefined1 auVar61 [8];
  long lVar62;
  bool bVar63;
  undefined1 auVar64 [8];
  Geometry *geometry;
  long lVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  short sVar72;
  float fVar73;
  float fVar106;
  float fVar107;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar108;
  float fVar109;
  float fVar126;
  float fVar128;
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar127;
  float fVar129;
  float fVar130;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar131;
  float fVar138;
  float fVar140;
  vfloat4 v;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar132;
  float fVar139;
  float fVar141;
  float fVar142;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar143;
  float fVar144;
  float fVar155;
  float fVar157;
  vfloat4 v_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar160;
  float fVar168;
  float fVar169;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar191;
  float fVar192;
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar193;
  float fVar197;
  float fVar198;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  float fVar205;
  float fVar206;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  float fVar207;
  float fVar209;
  float fVar210;
  undefined1 auVar208 [16];
  float fVar211;
  float fVar217;
  float fVar218;
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar219;
  float fVar224;
  float fVar225;
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar236;
  float fVar239;
  float fVar242;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  float fVar237;
  float fVar238;
  float fVar240;
  float fVar241;
  float fVar243;
  float fVar244;
  undefined1 auVar235 [16];
  float fVar245;
  float fVar246;
  float fVar257;
  float fVar259;
  float fVar261;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar258;
  float fVar260;
  float fVar262;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar271;
  float fVar273;
  float fVar275;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar272;
  float fVar274;
  float fVar276;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar277;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  ulong local_458;
  int local_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 local_3d8;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  Ray *local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  ulong local_318;
  Precalculations *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [40];
  float local_2b0;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  RTCFilterFunctionN local_298;
  float local_290;
  float local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  uint local_27c;
  uint local_278;
  ulong local_260;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  uint local_f8;
  int local_f4;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  float local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [4];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 uVar104;
  undefined2 uVar105;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  
  PVar18 = prim[1];
  uVar54 = (ulong)(byte)PVar18;
  lVar23 = uVar54 * 0x25;
  pPVar7 = prim + lVar23 + 6;
  fVar140 = *(float *)(pPVar7 + 0xc);
  fVar143 = ((ray->org).field_0.m128[0] - *(float *)pPVar7) * fVar140;
  fVar155 = ((ray->org).field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar140;
  fVar157 = ((ray->org).field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar140;
  fVar131 = fVar140 * (ray->dir).field_0.m128[0];
  fVar138 = fVar140 * (ray->dir).field_0.m128[1];
  fVar140 = fVar140 * (ray->dir).field_0.m128[2];
  uVar56 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar104 = (undefined1)((uint)uVar56 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar56 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar56));
  uVar104 = (undefined1)((uint)uVar56 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar56,(char)uVar56);
  uVar55 = CONCAT62(uVar26,sVar72);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar55;
  auVar74._12_2_ = uVar105;
  auVar74._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar134._12_4_ = auVar74._12_4_;
  auVar134._8_2_ = 0;
  auVar134._0_8_ = uVar55;
  auVar134._10_2_ = uVar105;
  auVar75._10_6_ = auVar134._10_6_;
  auVar75._8_2_ = uVar105;
  auVar75._0_8_ = uVar55;
  uVar105 = (undefined2)uVar26;
  auVar27._4_8_ = auVar75._8_8_;
  auVar27._2_2_ = uVar105;
  auVar27._0_2_ = uVar105;
  fVar263 = (float)((int)sVar72 >> 8);
  fVar271 = (float)(auVar27._0_4_ >> 0x18);
  fVar273 = (float)(auVar75._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar104 = (undefined1)((uint)uVar56 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar56 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar56));
  uVar104 = (undefined1)((uint)uVar56 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar56,(char)uVar56);
  uVar55 = CONCAT62(uVar26,sVar72);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar55;
  auVar112._12_2_ = uVar105;
  auVar112._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar55;
  auVar111._10_2_ = uVar105;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar105;
  auVar110._0_8_ = uVar55;
  uVar105 = (undefined2)uVar26;
  auVar28._4_8_ = auVar110._8_8_;
  auVar28._2_2_ = uVar105;
  auVar28._0_2_ = uVar105;
  fVar160 = (float)((int)sVar72 >> 8);
  fVar168 = (float)(auVar28._0_4_ >> 0x18);
  fVar169 = (float)(auVar110._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar104 = (undefined1)((uint)uVar56 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar56 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar56));
  uVar104 = (undefined1)((uint)uVar56 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar56,(char)uVar56);
  uVar55 = CONCAT62(uVar26,sVar72);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar55;
  auVar115._12_2_ = uVar105;
  auVar115._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar55;
  auVar114._10_2_ = uVar105;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar105;
  auVar113._0_8_ = uVar55;
  uVar105 = (undefined2)uVar26;
  auVar29._4_8_ = auVar113._8_8_;
  auVar29._2_2_ = uVar105;
  auVar29._0_2_ = uVar105;
  fVar193 = (float)((int)sVar72 >> 8);
  fVar197 = (float)(auVar29._0_4_ >> 0x18);
  fVar198 = (float)(auVar113._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar104 = (undefined1)((uint)uVar56 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar56 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar56));
  uVar104 = (undefined1)((uint)uVar56 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar56,(char)uVar56);
  uVar55 = CONCAT62(uVar26,sVar72);
  auVar118._8_4_ = 0;
  auVar118._0_8_ = uVar55;
  auVar118._12_2_ = uVar105;
  auVar118._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._8_2_ = 0;
  auVar117._0_8_ = uVar55;
  auVar117._10_2_ = uVar105;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._8_2_ = uVar105;
  auVar116._0_8_ = uVar55;
  uVar105 = (undefined2)uVar26;
  auVar30._4_8_ = auVar116._8_8_;
  auVar30._2_2_ = uVar105;
  auVar30._0_2_ = uVar105;
  fVar73 = (float)((int)sVar72 >> 8);
  fVar106 = (float)(auVar30._0_4_ >> 0x18);
  fVar107 = (float)(auVar116._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar104 = (undefined1)((uint)uVar56 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar56 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar56));
  uVar104 = (undefined1)((uint)uVar56 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar56,(char)uVar56);
  uVar55 = CONCAT62(uVar26,sVar72);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar55;
  auVar173._12_2_ = uVar105;
  auVar173._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar55;
  auVar172._10_2_ = uVar105;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar105;
  auVar171._0_8_ = uVar55;
  uVar105 = (undefined2)uVar26;
  auVar31._4_8_ = auVar171._8_8_;
  auVar31._2_2_ = uVar105;
  auVar31._0_2_ = uVar105;
  fVar199 = (float)((int)sVar72 >> 8);
  fVar205 = (float)(auVar31._0_4_ >> 0x18);
  fVar206 = (float)(auVar171._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar54 + 6);
  uVar104 = (undefined1)((uint)uVar56 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar56 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar56));
  uVar104 = (undefined1)((uint)uVar56 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar56,(char)uVar56);
  uVar55 = CONCAT62(uVar26,sVar72);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar55;
  auVar176._12_2_ = uVar105;
  auVar176._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar55;
  auVar175._10_2_ = uVar105;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar105;
  auVar174._0_8_ = uVar55;
  uVar105 = (undefined2)uVar26;
  auVar32._4_8_ = auVar174._8_8_;
  auVar32._2_2_ = uVar105;
  auVar32._0_2_ = uVar105;
  fVar211 = (float)((int)sVar72 >> 8);
  fVar217 = (float)(auVar32._0_4_ >> 0x18);
  fVar218 = (float)(auVar174._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar104 = (undefined1)((uint)uVar56 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar56 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar56));
  uVar104 = (undefined1)((uint)uVar56 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar56,(char)uVar56);
  uVar55 = CONCAT62(uVar26,sVar72);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar55;
  auVar179._12_2_ = uVar105;
  auVar179._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar55;
  auVar178._10_2_ = uVar105;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar105;
  auVar177._0_8_ = uVar55;
  uVar105 = (undefined2)uVar26;
  auVar33._4_8_ = auVar177._8_8_;
  auVar33._2_2_ = uVar105;
  auVar33._0_2_ = uVar105;
  fVar207 = (float)((int)sVar72 >> 8);
  fVar209 = (float)(auVar33._0_4_ >> 0x18);
  fVar210 = (float)(auVar177._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar104 = (undefined1)((uint)uVar56 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar56 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar56));
  uVar104 = (undefined1)((uint)uVar56 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar56,(char)uVar56);
  uVar55 = CONCAT62(uVar26,sVar72);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar55;
  auVar182._12_2_ = uVar105;
  auVar182._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar55;
  auVar181._10_2_ = uVar105;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar105;
  auVar180._0_8_ = uVar55;
  uVar105 = (undefined2)uVar26;
  auVar34._4_8_ = auVar180._8_8_;
  auVar34._2_2_ = uVar105;
  auVar34._0_2_ = uVar105;
  fVar219 = (float)((int)sVar72 >> 8);
  fVar224 = (float)(auVar34._0_4_ >> 0x18);
  fVar225 = (float)(auVar180._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar104 = (undefined1)((uint)uVar56 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar56 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar56));
  uVar104 = (undefined1)((uint)uVar56 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar56,(char)uVar56);
  uVar55 = CONCAT62(uVar26,sVar72);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar55;
  auVar185._12_2_ = uVar105;
  auVar185._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar55;
  auVar184._10_2_ = uVar105;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar105;
  auVar183._0_8_ = uVar55;
  uVar105 = (undefined2)uVar26;
  auVar35._4_8_ = auVar183._8_8_;
  auVar35._2_2_ = uVar105;
  auVar35._0_2_ = uVar105;
  fVar108 = (float)((int)sVar72 >> 8);
  fVar126 = (float)(auVar35._0_4_ >> 0x18);
  fVar128 = (float)(auVar183._8_4_ >> 0x18);
  fVar245 = fVar131 * fVar263 + fVar138 * fVar160 + fVar140 * fVar193;
  fVar257 = fVar131 * fVar271 + fVar138 * fVar168 + fVar140 * fVar197;
  fVar259 = fVar131 * fVar273 + fVar138 * fVar169 + fVar140 * fVar198;
  fVar261 = fVar131 * (float)(auVar134._12_4_ >> 0x18) +
            fVar138 * (float)(auVar111._12_4_ >> 0x18) + fVar140 * (float)(auVar114._12_4_ >> 0x18);
  fVar227 = fVar131 * fVar73 + fVar138 * fVar199 + fVar140 * fVar211;
  fVar236 = fVar131 * fVar106 + fVar138 * fVar205 + fVar140 * fVar217;
  fVar239 = fVar131 * fVar107 + fVar138 * fVar206 + fVar140 * fVar218;
  fVar242 = fVar131 * (float)(auVar117._12_4_ >> 0x18) +
            fVar138 * (float)(auVar172._12_4_ >> 0x18) + fVar140 * (float)(auVar175._12_4_ >> 0x18);
  fVar170 = fVar131 * fVar207 + fVar138 * fVar219 + fVar140 * fVar108;
  fVar191 = fVar131 * fVar209 + fVar138 * fVar224 + fVar140 * fVar126;
  fVar192 = fVar131 * fVar210 + fVar138 * fVar225 + fVar140 * fVar128;
  fVar131 = fVar131 * (float)(auVar178._12_4_ >> 0x18) +
            fVar138 * (float)(auVar181._12_4_ >> 0x18) + fVar140 * (float)(auVar184._12_4_ >> 0x18);
  fVar264 = fVar263 * fVar143 + fVar160 * fVar155 + fVar193 * fVar157;
  fVar271 = fVar271 * fVar143 + fVar168 * fVar155 + fVar197 * fVar157;
  fVar273 = fVar273 * fVar143 + fVar169 * fVar155 + fVar198 * fVar157;
  fVar275 = (float)(auVar134._12_4_ >> 0x18) * fVar143 +
            (float)(auVar111._12_4_ >> 0x18) * fVar155 + (float)(auVar114._12_4_ >> 0x18) * fVar157;
  fVar211 = fVar73 * fVar143 + fVar199 * fVar155 + fVar211 * fVar157;
  fVar217 = fVar106 * fVar143 + fVar205 * fVar155 + fVar217 * fVar157;
  fVar218 = fVar107 * fVar143 + fVar206 * fVar155 + fVar218 * fVar157;
  fVar263 = (float)(auVar117._12_4_ >> 0x18) * fVar143 +
            (float)(auVar172._12_4_ >> 0x18) * fVar155 + (float)(auVar175._12_4_ >> 0x18) * fVar157;
  fVar207 = fVar143 * fVar207 + fVar155 * fVar219 + fVar157 * fVar108;
  fVar209 = fVar143 * fVar209 + fVar155 * fVar224 + fVar157 * fVar126;
  fVar210 = fVar143 * fVar210 + fVar155 * fVar225 + fVar157 * fVar128;
  fVar219 = fVar143 * (float)(auVar178._12_4_ >> 0x18) +
            fVar155 * (float)(auVar181._12_4_ >> 0x18) + fVar157 * (float)(auVar184._12_4_ >> 0x18);
  fVar140 = (float)DAT_01f80d30;
  fVar73 = DAT_01f80d30._4_4_;
  fVar106 = DAT_01f80d30._8_4_;
  fVar107 = DAT_01f80d30._12_4_;
  uVar66 = -(uint)(fVar140 <= ABS(fVar245));
  uVar67 = -(uint)(fVar73 <= ABS(fVar257));
  uVar68 = -(uint)(fVar106 <= ABS(fVar259));
  uVar69 = -(uint)(fVar107 <= ABS(fVar261));
  auVar247._0_4_ = (uint)fVar245 & uVar66;
  auVar247._4_4_ = (uint)fVar257 & uVar67;
  auVar247._8_4_ = (uint)fVar259 & uVar68;
  auVar247._12_4_ = (uint)fVar261 & uVar69;
  auVar145._0_4_ = ~uVar66 & (uint)fVar140;
  auVar145._4_4_ = ~uVar67 & (uint)fVar73;
  auVar145._8_4_ = ~uVar68 & (uint)fVar106;
  auVar145._12_4_ = ~uVar69 & (uint)fVar107;
  auVar145 = auVar145 | auVar247;
  uVar66 = -(uint)(fVar140 <= ABS(fVar227));
  uVar67 = -(uint)(fVar73 <= ABS(fVar236));
  uVar68 = -(uint)(fVar106 <= ABS(fVar239));
  uVar69 = -(uint)(fVar107 <= ABS(fVar242));
  auVar230._0_4_ = (uint)fVar227 & uVar66;
  auVar230._4_4_ = (uint)fVar236 & uVar67;
  auVar230._8_4_ = (uint)fVar239 & uVar68;
  auVar230._12_4_ = (uint)fVar242 & uVar69;
  auVar194._0_4_ = ~uVar66 & (uint)fVar140;
  auVar194._4_4_ = ~uVar67 & (uint)fVar73;
  auVar194._8_4_ = ~uVar68 & (uint)fVar106;
  auVar194._12_4_ = ~uVar69 & (uint)fVar107;
  auVar194 = auVar194 | auVar230;
  uVar66 = -(uint)(fVar140 <= ABS(fVar170));
  uVar67 = -(uint)(fVar73 <= ABS(fVar191));
  uVar68 = -(uint)(fVar106 <= ABS(fVar192));
  uVar69 = -(uint)(fVar107 <= ABS(fVar131));
  auVar186._0_4_ = (uint)fVar170 & uVar66;
  auVar186._4_4_ = (uint)fVar191 & uVar67;
  auVar186._8_4_ = (uint)fVar192 & uVar68;
  auVar186._12_4_ = (uint)fVar131 & uVar69;
  auVar200._0_4_ = ~uVar66 & (uint)fVar140;
  auVar200._4_4_ = ~uVar67 & (uint)fVar73;
  auVar200._8_4_ = ~uVar68 & (uint)fVar106;
  auVar200._12_4_ = ~uVar69 & (uint)fVar107;
  auVar200 = auVar200 | auVar186;
  auVar75 = rcpps(_DAT_01f80d30,auVar145);
  fVar140 = auVar75._0_4_;
  fVar107 = auVar75._4_4_;
  fVar160 = auVar75._8_4_;
  fVar199 = auVar75._12_4_;
  fVar140 = (1.0 - auVar145._0_4_ * fVar140) * fVar140 + fVar140;
  fVar107 = (1.0 - auVar145._4_4_ * fVar107) * fVar107 + fVar107;
  fVar160 = (1.0 - auVar145._8_4_ * fVar160) * fVar160 + fVar160;
  fVar199 = (1.0 - auVar145._12_4_ * fVar199) * fVar199 + fVar199;
  auVar75 = rcpps(auVar75,auVar194);
  fVar73 = auVar75._0_4_;
  fVar108 = auVar75._4_4_;
  fVar168 = auVar75._8_4_;
  fVar205 = auVar75._12_4_;
  fVar73 = (1.0 - auVar194._0_4_ * fVar73) * fVar73 + fVar73;
  fVar108 = (1.0 - auVar194._4_4_ * fVar108) * fVar108 + fVar108;
  fVar168 = (1.0 - auVar194._8_4_ * fVar168) * fVar168 + fVar168;
  fVar205 = (1.0 - auVar194._12_4_ * fVar205) * fVar205 + fVar205;
  auVar75 = rcpps(auVar75,auVar200);
  fVar106 = auVar75._0_4_;
  fVar126 = auVar75._4_4_;
  fVar169 = auVar75._8_4_;
  fVar206 = auVar75._12_4_;
  fVar106 = (1.0 - auVar200._0_4_ * fVar106) * fVar106 + fVar106;
  fVar126 = (1.0 - auVar200._4_4_ * fVar126) * fVar126 + fVar126;
  fVar169 = (1.0 - auVar200._8_4_ * fVar169) * fVar169 + fVar169;
  fVar206 = (1.0 - auVar200._12_4_ * fVar206) * fVar206 + fVar206;
  fVar224 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  uVar55 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar105 = (undefined2)(uVar55 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar55;
  auVar78._12_2_ = uVar105;
  auVar78._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar55 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar55;
  auVar77._10_2_ = uVar105;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar105;
  auVar76._0_8_ = uVar55;
  uVar105 = (undefined2)(uVar55 >> 0x10);
  auVar36._4_8_ = auVar76._8_8_;
  auVar36._2_2_ = uVar105;
  auVar36._0_2_ = uVar105;
  fVar128 = (float)(auVar36._0_4_ >> 0x10);
  fVar170 = (float)(auVar76._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar105 = (undefined2)(uVar9 >> 0x30);
  auVar148._8_4_ = 0;
  auVar148._0_8_ = uVar9;
  auVar148._12_2_ = uVar105;
  auVar148._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar9 >> 0x20);
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._8_2_ = 0;
  auVar147._0_8_ = uVar9;
  auVar147._10_2_ = uVar105;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._8_2_ = uVar105;
  auVar146._0_8_ = uVar9;
  uVar105 = (undefined2)(uVar9 >> 0x10);
  auVar37._4_8_ = auVar146._8_8_;
  auVar37._2_2_ = uVar105;
  auVar37._0_2_ = uVar105;
  uVar10 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar105 = (undefined2)(uVar10 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar10;
  auVar81._12_2_ = uVar105;
  auVar81._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar10 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar10;
  auVar80._10_2_ = uVar105;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar105;
  auVar79._0_8_ = uVar10;
  uVar105 = (undefined2)(uVar10 >> 0x10);
  auVar38._4_8_ = auVar79._8_8_;
  auVar38._2_2_ = uVar105;
  auVar38._0_2_ = uVar105;
  fVar131 = (float)(auVar38._0_4_ >> 0x10);
  fVar191 = (float)(auVar79._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar105 = (undefined2)(uVar11 >> 0x30);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar11;
  auVar203._12_2_ = uVar105;
  auVar203._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar11 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar11;
  auVar202._10_2_ = uVar105;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar105;
  auVar201._0_8_ = uVar11;
  uVar105 = (undefined2)(uVar11 >> 0x10);
  auVar39._4_8_ = auVar201._8_8_;
  auVar39._2_2_ = uVar105;
  auVar39._0_2_ = uVar105;
  uVar12 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar105 = (undefined2)(uVar12 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar12;
  auVar84._12_2_ = uVar105;
  auVar84._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar12 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar12;
  auVar83._10_2_ = uVar105;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar105;
  auVar82._0_8_ = uVar12;
  uVar105 = (undefined2)(uVar12 >> 0x10);
  auVar40._4_8_ = auVar82._8_8_;
  auVar40._2_2_ = uVar105;
  auVar40._0_2_ = uVar105;
  fVar138 = (float)(auVar40._0_4_ >> 0x10);
  fVar192 = (float)(auVar82._8_4_ >> 0x10);
  uVar57 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar54 * 2 + uVar57 + 6);
  uVar105 = (undefined2)(uVar13 >> 0x30);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar13;
  auVar214._12_2_ = uVar105;
  auVar214._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar13 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar13;
  auVar213._10_2_ = uVar105;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar105;
  auVar212._0_8_ = uVar13;
  uVar105 = (undefined2)(uVar13 >> 0x10);
  auVar41._4_8_ = auVar212._8_8_;
  auVar41._2_2_ = uVar105;
  auVar41._0_2_ = uVar105;
  uVar57 = *(ulong *)(prim + uVar57 + 6);
  uVar105 = (undefined2)(uVar57 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar57;
  auVar87._12_2_ = uVar105;
  auVar87._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar57 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar57;
  auVar86._10_2_ = uVar105;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar105;
  auVar85._0_8_ = uVar57;
  uVar105 = (undefined2)(uVar57 >> 0x10);
  auVar42._4_8_ = auVar85._8_8_;
  auVar42._2_2_ = uVar105;
  auVar42._0_2_ = uVar105;
  fVar143 = (float)(auVar42._0_4_ >> 0x10);
  fVar193 = (float)(auVar85._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar105 = (undefined2)(uVar14 >> 0x30);
  auVar222._8_4_ = 0;
  auVar222._0_8_ = uVar14;
  auVar222._12_2_ = uVar105;
  auVar222._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar14 >> 0x20);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar14;
  auVar221._10_2_ = uVar105;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar105;
  auVar220._0_8_ = uVar14;
  uVar105 = (undefined2)(uVar14 >> 0x10);
  auVar43._4_8_ = auVar220._8_8_;
  auVar43._2_2_ = uVar105;
  auVar43._0_2_ = uVar105;
  uVar15 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar105 = (undefined2)(uVar15 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar15;
  auVar90._12_2_ = uVar105;
  auVar90._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar15 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar15;
  auVar89._10_2_ = uVar105;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar105;
  auVar88._0_8_ = uVar15;
  uVar105 = (undefined2)(uVar15 >> 0x10);
  auVar44._4_8_ = auVar88._8_8_;
  auVar44._2_2_ = uVar105;
  auVar44._0_2_ = uVar105;
  fVar155 = (float)(auVar44._0_4_ >> 0x10);
  fVar197 = (float)(auVar88._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar105 = (undefined2)(uVar16 >> 0x30);
  auVar233._8_4_ = 0;
  auVar233._0_8_ = uVar16;
  auVar233._12_2_ = uVar105;
  auVar233._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar16 >> 0x20);
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._8_2_ = 0;
  auVar232._0_8_ = uVar16;
  auVar232._10_2_ = uVar105;
  auVar231._10_6_ = auVar232._10_6_;
  auVar231._8_2_ = uVar105;
  auVar231._0_8_ = uVar16;
  uVar105 = (undefined2)(uVar16 >> 0x10);
  auVar45._4_8_ = auVar231._8_8_;
  auVar45._2_2_ = uVar105;
  auVar45._0_2_ = uVar105;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar54) + 6);
  uVar105 = (undefined2)(uVar17 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar17;
  auVar93._12_2_ = uVar105;
  auVar93._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar17 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar17;
  auVar92._10_2_ = uVar105;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar105;
  auVar91._0_8_ = uVar17;
  uVar105 = (undefined2)(uVar17 >> 0x10);
  auVar46._4_8_ = auVar91._8_8_;
  auVar46._2_2_ = uVar105;
  auVar46._0_2_ = uVar105;
  fVar157 = (float)(auVar46._0_4_ >> 0x10);
  fVar198 = (float)(auVar91._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar105 = (undefined2)(uVar54 >> 0x30);
  auVar250._8_4_ = 0;
  auVar250._0_8_ = uVar54;
  auVar250._12_2_ = uVar105;
  auVar250._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar54 >> 0x20);
  auVar249._12_4_ = auVar250._12_4_;
  auVar249._8_2_ = 0;
  auVar249._0_8_ = uVar54;
  auVar249._10_2_ = uVar105;
  auVar248._10_6_ = auVar249._10_6_;
  auVar248._8_2_ = uVar105;
  auVar248._0_8_ = uVar54;
  uVar105 = (undefined2)(uVar54 >> 0x10);
  auVar47._4_8_ = auVar248._8_8_;
  auVar47._2_2_ = uVar105;
  auVar47._0_2_ = uVar105;
  auVar149._0_8_ =
       CONCAT44(((((float)(auVar37._0_4_ >> 0x10) - fVar128) * fVar224 + fVar128) - fVar271) *
                fVar107,((((float)(int)(short)uVar9 - (float)(int)(short)uVar55) * fVar224 +
                         (float)(int)(short)uVar55) - fVar264) * fVar140);
  auVar149._8_4_ =
       ((((float)(auVar146._8_4_ >> 0x10) - fVar170) * fVar224 + fVar170) - fVar273) * fVar160;
  auVar149._12_4_ =
       ((((float)(auVar147._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar275) * fVar199;
  auVar204._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar224 +
        (float)(int)(short)uVar10) - fVar264) * fVar140;
  auVar204._4_4_ =
       ((((float)(auVar39._0_4_ >> 0x10) - fVar131) * fVar224 + fVar131) - fVar271) * fVar107;
  auVar204._8_4_ =
       ((((float)(auVar201._8_4_ >> 0x10) - fVar191) * fVar224 + fVar191) - fVar273) * fVar160;
  auVar204._12_4_ =
       ((((float)(auVar202._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar275) * fVar199;
  auVar215._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar138) * fVar224 + fVar138) - fVar217) *
                fVar108,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar224 +
                         (float)(int)(short)uVar12) - fVar211) * fVar73);
  auVar215._8_4_ =
       ((((float)(auVar212._8_4_ >> 0x10) - fVar192) * fVar224 + fVar192) - fVar218) * fVar168;
  auVar215._12_4_ =
       ((((float)(auVar213._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar263) * fVar205;
  auVar223._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar57) * fVar224 +
        (float)(int)(short)uVar57) - fVar211) * fVar73;
  auVar223._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar143) * fVar224 + fVar143) - fVar217) * fVar108;
  auVar223._8_4_ =
       ((((float)(auVar220._8_4_ >> 0x10) - fVar193) * fVar224 + fVar193) - fVar218) * fVar168;
  auVar223._12_4_ =
       ((((float)(auVar221._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar263) * fVar205;
  auVar234._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar155) * fVar224 + fVar155) - fVar209) *
                fVar126,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar224 +
                         (float)(int)(short)uVar15) - fVar207) * fVar106);
  auVar234._8_4_ =
       ((((float)(auVar231._8_4_ >> 0x10) - fVar197) * fVar224 + fVar197) - fVar210) * fVar169;
  auVar234._12_4_ =
       ((((float)(auVar232._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar219) * fVar206;
  auVar251._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar17) * fVar224 +
        (float)(int)(short)uVar17) - fVar207) * fVar106;
  auVar251._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar157) * fVar224 + fVar157) - fVar209) * fVar126;
  auVar251._8_4_ =
       ((((float)(auVar248._8_4_ >> 0x10) - fVar198) * fVar224 + fVar198) - fVar210) * fVar169;
  auVar251._12_4_ =
       ((((float)(auVar249._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar219) * fVar206;
  auVar133._8_4_ = auVar149._8_4_;
  auVar133._0_8_ = auVar149._0_8_;
  auVar133._12_4_ = auVar149._12_4_;
  auVar134 = minps(auVar133,auVar204);
  auVar94._8_4_ = auVar215._8_4_;
  auVar94._0_8_ = auVar215._0_8_;
  auVar94._12_4_ = auVar215._12_4_;
  auVar75 = minps(auVar94,auVar223);
  auVar134 = maxps(auVar134,auVar75);
  auVar95._8_4_ = auVar234._8_4_;
  auVar95._0_8_ = auVar234._0_8_;
  auVar95._12_4_ = auVar234._12_4_;
  auVar75 = minps(auVar95,auVar251);
  uVar56 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar119._4_4_ = uVar56;
  auVar119._0_4_ = uVar56;
  auVar119._8_4_ = uVar56;
  auVar119._12_4_ = uVar56;
  auVar75 = maxps(auVar75,auVar119);
  auVar75 = maxps(auVar134,auVar75);
  local_48 = auVar75._0_4_ * 0.99999964;
  fStack_44 = auVar75._4_4_ * 0.99999964;
  fStack_40 = auVar75._8_4_ * 0.99999964;
  fStack_3c = auVar75._12_4_ * 0.99999964;
  auVar75 = maxps(auVar149,auVar204);
  auVar134 = maxps(auVar215,auVar223);
  auVar75 = minps(auVar75,auVar134);
  auVar134 = maxps(auVar234,auVar251);
  fVar140 = ray->tfar;
  auVar96._4_4_ = fVar140;
  auVar96._0_4_ = fVar140;
  auVar96._8_4_ = fVar140;
  auVar96._12_4_ = fVar140;
  auVar134 = minps(auVar134,auVar96);
  auVar75 = minps(auVar75,auVar134);
  uVar66 = (uint)(byte)PVar18;
  auVar120._0_4_ = -(uint)(uVar66 != 0 && local_48 <= auVar75._0_4_ * 1.0000004);
  auVar120._4_4_ = -(uint)(1 < uVar66 && fStack_44 <= auVar75._4_4_ * 1.0000004);
  auVar120._8_4_ = -(uint)(2 < uVar66 && fStack_40 <= auVar75._8_4_ * 1.0000004);
  auVar120._12_4_ = -(uint)(3 < uVar66 && fStack_3c <= auVar75._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar120);
  if (uVar66 != 0) {
    uVar66 = uVar66 & 0xff;
    local_308 = mm_lookupmask_ps._0_8_;
    uStack_300 = mm_lookupmask_ps._8_8_;
    local_370 = ray;
    local_310 = pre;
    do {
      lVar23 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      local_318 = (ulong)*(uint *)(prim + 2);
      local_260 = (ulong)*(uint *)(prim + lVar23 * 4 + 6);
      pGVar20 = (context->scene->geometries).items[local_318].ptr;
      uVar55 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                               local_260 *
                               pGVar20[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar140 = pGVar20->fnumTimeSegments;
      fVar73 = (pGVar20->time_range).lower;
      fVar106 = (((ray->dir).field_0.m128[3] - fVar73) / ((pGVar20->time_range).upper - fVar73)) *
                fVar140;
      fVar73 = floorf(fVar106);
      fVar140 = fVar140 + -1.0;
      if (fVar140 <= fVar73) {
        fVar73 = fVar140;
      }
      fVar140 = 0.0;
      if (0.0 <= fVar73) {
        fVar140 = fVar73;
      }
      _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar62 = (long)(int)fVar140 * 0x38;
      lVar23 = *(long *)(_Var21 + 0x10 + lVar62);
      auVar64 = (undefined1  [8])(uVar55 + 3);
      lVar65 = *(long *)(_Var21 + 0x38 + lVar62);
      lVar22 = *(long *)(_Var21 + 0x48 + lVar62);
      pfVar1 = (float *)(lVar65 + uVar55 * lVar22);
      pfVar2 = (float *)(lVar65 + (uVar55 + 1) * lVar22);
      pfVar3 = (float *)(lVar65 + (uVar55 + 2) * lVar22);
      fVar106 = fVar106 - fVar140;
      fVar140 = 1.0 - fVar106;
      pfVar4 = (float *)(lVar65 + lVar22 * (long)auVar64);
      lVar65 = *(long *)(_Var21 + lVar62);
      pfVar5 = (float *)(lVar65 + lVar23 * uVar55);
      pfVar6 = (float *)(lVar65 + lVar23 * (uVar55 + 1));
      local_228 = *pfVar5 * fVar140 + *pfVar1 * fVar106;
      fStack_224 = pfVar5[1] * fVar140 + pfVar1[1] * fVar106;
      fStack_220 = pfVar5[2] * fVar140 + pfVar1[2] * fVar106;
      fStack_21c = pfVar5[3] * fVar140 + pfVar1[3] * fVar106;
      local_238 = *pfVar6 * fVar140 + *pfVar2 * fVar106;
      fStack_234 = pfVar6[1] * fVar140 + pfVar2[1] * fVar106;
      fStack_230 = pfVar6[2] * fVar140 + pfVar2[2] * fVar106;
      fStack_22c = pfVar6[3] * fVar140 + pfVar2[3] * fVar106;
      pfVar1 = (float *)(lVar65 + lVar23 * (uVar55 + 2));
      pfVar2 = (float *)(lVar65 + lVar23 * (long)auVar64);
      local_248 = *pfVar1 * fVar140 + *pfVar3 * fVar106;
      fStack_244 = pfVar1[1] * fVar140 + pfVar3[1] * fVar106;
      fStack_240 = pfVar1[2] * fVar140 + pfVar3[2] * fVar106;
      fStack_23c = pfVar1[3] * fVar140 + pfVar3[3] * fVar106;
      local_218 = fVar140 * *pfVar2 + fVar106 * *pfVar4;
      fStack_214 = fVar140 * pfVar2[1] + fVar106 * pfVar4[1];
      fStack_210 = fVar140 * pfVar2[2] + fVar106 * pfVar4[2];
      fStack_20c = fVar140 * pfVar2[3] + fVar106 * pfVar4[3];
      local_1f8 = (local_370->org).field_0.m128[0];
      fStack_1f4 = (local_370->org).field_0.m128[1];
      fStack_1f0 = (local_370->org).field_0.m128[2];
      fStack_1ec = (local_370->org).field_0.m128[3];
      fVar160 = local_228 - local_1f8;
      fVar168 = fStack_224 - fStack_1f4;
      fVar169 = fStack_220 - fStack_1f0;
      fVar140 = (local_310->ray_space).vx.field_0.m128[0];
      fVar73 = (local_310->ray_space).vx.field_0.m128[1];
      fVar106 = (local_310->ray_space).vx.field_0.m128[2];
      fVar107 = (local_310->ray_space).vx.field_0.m128[3];
      fVar108 = (local_310->ray_space).vy.field_0.m128[0];
      fVar126 = (local_310->ray_space).vy.field_0.m128[1];
      fVar128 = (local_310->ray_space).vy.field_0.m128[2];
      fVar131 = (local_310->ray_space).vy.field_0.m128[3];
      fVar138 = (local_310->ray_space).vz.field_0.m128[0];
      fVar143 = (local_310->ray_space).vz.field_0.m128[1];
      fVar155 = (local_310->ray_space).vz.field_0.m128[2];
      fVar157 = (local_310->ray_space).vz.field_0.m128[3];
      local_1c8 = fVar160 * fVar140 + fVar168 * fVar108 + fVar169 * fVar138;
      local_1b8 = fVar160 * fVar73 + fVar168 * fVar126 + fVar169 * fVar143;
      fVar192 = fVar160 * fVar106 + fVar168 * fVar128 + fVar169 * fVar155;
      fVar160 = local_238 - local_1f8;
      fVar168 = fStack_234 - fStack_1f4;
      fVar169 = fStack_230 - fStack_1f0;
      local_1d8 = fVar160 * fVar140 + fVar168 * fVar108 + fVar169 * fVar138;
      local_1e8 = fVar160 * fVar73 + fVar168 * fVar126 + fVar169 * fVar143;
      fVar170 = fVar160 * fVar106 + fVar168 * fVar128 + fVar169 * fVar155;
      fVar160 = local_248 - local_1f8;
      fVar168 = fStack_244 - fStack_1f4;
      fVar169 = fStack_240 - fStack_1f0;
      local_358 = fVar160 * fVar140 + fVar168 * fVar108 + fVar169 * fVar138;
      fVar191 = fVar160 * fVar73 + fVar168 * fVar126 + fVar169 * fVar143;
      fStack_380 = fVar160 * fVar106 + fVar168 * fVar128 + fVar169 * fVar155;
      fStack_37c = fVar160 * fVar107 + fVar168 * fVar131 + fVar169 * fVar157;
      fVar160 = local_218 - local_1f8;
      fVar168 = fStack_214 - fStack_1f4;
      fVar169 = fStack_210 - fStack_1f0;
      iVar19 = (int)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_3c8 = fVar160 * fVar140 + fVar168 * fVar108 + fVar169 * fVar138;
      fVar73 = fVar160 * fVar73 + fVar168 * fVar126 + fVar169 * fVar143;
      fStack_360 = fVar160 * fVar106 + fVar168 * fVar128 + fVar169 * fVar155;
      fStack_35c = fVar160 * fVar107 + fVar168 * fVar131 + fVar169 * fVar157;
      auVar252._0_8_ = CONCAT44(local_1b8,local_1c8) & 0x7fffffff7fffffff;
      auVar252._8_4_ = ABS(fVar192);
      auVar252._12_4_ = ABS(fStack_21c);
      auVar150._0_8_ = CONCAT44(local_1e8,local_1d8) & 0x7fffffff7fffffff;
      auVar150._8_4_ = ABS(fVar170);
      auVar150._12_4_ = ABS(fStack_22c);
      auVar134 = maxps(auVar252,auVar150);
      auVar161._0_8_ = CONCAT44(fVar191,local_358) & 0x7fffffff7fffffff;
      auVar161._8_4_ = ABS(fStack_380);
      auVar161._12_4_ = ABS(fStack_23c);
      auVar121._0_8_ = CONCAT44(fVar73,local_3c8) & 0x7fffffff7fffffff;
      auVar121._8_4_ = ABS(fStack_360);
      auVar121._12_4_ = ABS(fStack_20c);
      auVar75 = maxps(auVar161,auVar121);
      auVar75 = maxps(auVar134,auVar75);
      fVar140 = auVar75._4_4_;
      if (auVar75._4_4_ <= auVar75._0_4_) {
        fVar140 = auVar75._0_4_;
      }
      fVar106 = (float)iVar19;
      auVar253._8_8_ = auVar75._8_8_;
      auVar253._0_8_ = auVar75._8_8_;
      if (auVar75._8_4_ <= fVar140) {
        auVar253._0_4_ = fVar140;
      }
      _local_258 = ZEXT416((uint)fVar106);
      fStack_3d0 = (float)-(uint)(2.0 < fVar106);
      fStack_3cc = (float)-(uint)(3.0 < fVar106);
      local_3d8 = CONCAT44(-(uint)(1.0 < fVar106),-(uint)(0.0 < fVar106));
      pRVar58 = (RTCIntersectArguments *)((long)iVar19 * 0x40);
      lVar23 = (long)iVar19 * 0x44;
      fStack_354 = local_358;
      fStack_350 = local_358;
      fStack_34c = local_358;
      local_3b8 = *(float *)(catmullrom_basis0 + lVar23 + 0xd8c);
      fStack_3b4 = *(float *)(catmullrom_basis0 + lVar23 + 0xd90);
      fStack_3b0 = *(float *)(catmullrom_basis0 + lVar23 + 0xd94);
      fStack_3ac = *(float *)(catmullrom_basis0 + lVar23 + 0xd98);
      fStack_3c4 = local_3c8;
      fStack_3c0 = local_3c8;
      fStack_3bc = local_3c8;
      pauVar8 = (undefined1 (*) [16])(catmullrom_basis0 + lVar23 + 0x908);
      fVar140 = *(float *)*pauVar8;
      fVar107 = *(float *)(catmullrom_basis0 + lVar23 + 0x90c);
      fVar108 = *(float *)(catmullrom_basis0 + lVar23 + 0x910);
      auVar27 = *(undefined1 (*) [12])*pauVar8;
      fVar126 = *(float *)(catmullrom_basis0 + lVar23 + 0x914);
      _local_2a8 = *pauVar8;
      local_3a8 = *(float *)(catmullrom_basis0 + lVar23 + 0x484);
      fStack_3a4 = *(float *)(catmullrom_basis0 + lVar23 + 0x488);
      fStack_3a0 = *(float *)(catmullrom_basis0 + lVar23 + 0x48c);
      fStack_39c = *(float *)(catmullrom_basis0 + lVar23 + 0x490);
      local_348 = *(float *)(catmullrom_basis0 + lVar23);
      fStack_344 = *(float *)(catmullrom_basis0 + lVar23 + 4);
      fStack_340 = *(float *)(catmullrom_basis0 + lVar23 + 8);
      fStack_33c = *(float *)(catmullrom_basis0 + lVar23 + 0xc);
      local_178 = local_1c8 * local_348 +
                  local_1d8 * local_3a8 + local_358 * fVar140 + local_3c8 * local_3b8;
      fStack_174 = local_1c8 * fStack_344 +
                   local_1d8 * fStack_3a4 + local_358 * fVar107 + local_3c8 * fStack_3b4;
      fStack_170 = local_1c8 * fStack_340 +
                   local_1d8 * fStack_3a0 + local_358 * fVar108 + local_3c8 * fStack_3b0;
      fStack_16c = local_1c8 * fStack_33c +
                   local_1d8 * fStack_39c + local_358 * fVar126 + local_3c8 * fStack_3ac;
      local_208._0_4_ =
           local_1b8 * local_348 + local_1e8 * local_3a8 + fVar191 * fVar140 + fVar73 * local_3b8;
      local_208._4_4_ =
           local_1b8 * fStack_344 + local_1e8 * fStack_3a4 + fVar191 * fVar107 + fVar73 * fStack_3b4
      ;
      fStack_200 = local_1b8 * fStack_340 +
                   local_1e8 * fStack_3a0 + fVar191 * fVar108 + fVar73 * fStack_3b0;
      fStack_1fc = local_1b8 * fStack_33c +
                   local_1e8 * fStack_39c + fVar191 * fVar126 + fVar73 * fStack_3ac;
      local_398._0_4_ =
           fStack_21c * local_348 +
           fStack_22c * local_3a8 + fStack_23c * fVar140 + fStack_20c * local_3b8;
      local_398._4_4_ =
           fStack_21c * fStack_344 +
           fStack_22c * fStack_3a4 + fStack_23c * fVar107 + fStack_20c * fStack_3b4;
      fStack_390 = fStack_21c * fStack_340 +
                   fStack_22c * fStack_3a0 + fStack_23c * fVar108 + fStack_20c * fStack_3b0;
      fStack_38c = fStack_21c * fStack_33c +
                   fStack_22c * fStack_39c + fStack_23c * fVar126 + fStack_20c * fStack_3ac;
      fVar140 = *(float *)(catmullrom_basis1 + lVar23 + 0xd8c);
      fVar107 = *(float *)(catmullrom_basis1 + lVar23 + 0xd90);
      fVar108 = *(float *)(catmullrom_basis1 + lVar23 + 0xd94);
      fVar128 = *(float *)(catmullrom_basis1 + lVar23 + 0xd98);
      pauVar8 = (undefined1 (*) [16])(catmullrom_basis1 + lVar23 + 0x908);
      fVar131 = *(float *)*pauVar8;
      fVar138 = *(float *)(catmullrom_basis1 + lVar23 + 0x90c);
      fVar143 = *(float *)(catmullrom_basis1 + lVar23 + 0x910);
      auVar28 = *(undefined1 (*) [12])*pauVar8;
      fVar155 = *(float *)(catmullrom_basis1 + lVar23 + 0x914);
      local_148 = fStack_20c;
      fStack_144 = fStack_20c;
      fStack_140 = fStack_20c;
      fStack_13c = fStack_20c;
      local_138 = fStack_23c;
      fStack_134 = fStack_23c;
      fStack_130 = fStack_23c;
      fStack_12c = fStack_23c;
      _local_188 = *pauVar8;
      fVar157 = *(float *)(catmullrom_basis1 + lVar23 + 0x484);
      fVar160 = *(float *)(catmullrom_basis1 + lVar23 + 0x488);
      fVar168 = *(float *)(catmullrom_basis1 + lVar23 + 0x48c);
      fVar169 = *(float *)(catmullrom_basis1 + lVar23 + 0x490);
      fStack_1d4 = local_1d8;
      fStack_1d0 = local_1d8;
      fStack_1cc = local_1d8;
      fStack_1e4 = local_1e8;
      fStack_1e0 = local_1e8;
      fStack_1dc = local_1e8;
      local_158 = fStack_22c;
      fStack_154 = fStack_22c;
      fStack_150 = fStack_22c;
      fStack_14c = fStack_22c;
      fVar193 = *(float *)(catmullrom_basis1 + lVar23);
      fVar197 = *(float *)(catmullrom_basis1 + lVar23 + 4);
      fVar198 = *(float *)(catmullrom_basis1 + lVar23 + 8);
      fVar199 = *(float *)(catmullrom_basis1 + lVar23 + 0xc);
      fStack_1c4 = local_1c8;
      fStack_1c0 = local_1c8;
      fStack_1bc = local_1c8;
      local_2f8._0_4_ =
           local_1c8 * fVar193 + local_1d8 * fVar157 + local_358 * fVar131 + local_3c8 * fVar140;
      local_2f8._4_4_ =
           local_1c8 * fVar197 + local_1d8 * fVar160 + local_358 * fVar138 + local_3c8 * fVar107;
      fStack_2f0 = local_1c8 * fVar198 +
                   local_1d8 * fVar168 + local_358 * fVar143 + local_3c8 * fVar108;
      fStack_2ec = local_1c8 * fVar199 +
                   local_1d8 * fVar169 + local_358 * fVar155 + local_3c8 * fVar128;
      fStack_1b4 = local_1b8;
      fStack_1b0 = local_1b8;
      fStack_1ac = local_1b8;
      fVar225 = local_1b8 * fVar193 + local_1e8 * fVar157 + fVar191 * fVar131 + fVar73 * fVar140;
      fVar227 = local_1b8 * fVar197 + local_1e8 * fVar160 + fVar191 * fVar138 + fVar73 * fVar107;
      fVar236 = local_1b8 * fVar198 + local_1e8 * fVar168 + fVar191 * fVar143 + fVar73 * fVar108;
      fVar239 = local_1b8 * fVar199 + local_1e8 * fVar169 + fVar191 * fVar155 + fVar73 * fVar128;
      local_168 = fStack_21c;
      fStack_164 = fStack_21c;
      fStack_160 = fStack_21c;
      fStack_15c = fStack_21c;
      fVar242 = fStack_21c * fVar193 +
                fStack_22c * fVar157 + fStack_23c * fVar131 + fStack_20c * fVar140;
      fVar245 = fStack_21c * fVar197 +
                fStack_22c * fVar160 + fStack_23c * fVar138 + fStack_20c * fVar107;
      fVar257 = fStack_21c * fVar198 +
                fStack_22c * fVar168 + fStack_23c * fVar143 + fStack_20c * fVar108;
      fVar259 = fStack_21c * fVar199 +
                fStack_22c * fVar169 + fStack_23c * fVar155 + fStack_20c * fVar128;
      fVar209 = (float)local_2f8._0_4_ - local_178;
      fVar210 = (float)local_2f8._4_4_ - fStack_174;
      fVar219 = fStack_2f0 - fStack_170;
      fVar224 = fStack_2ec - fStack_16c;
      fVar217 = fVar225 - (float)local_208._0_4_;
      fVar218 = fVar227 - (float)local_208._4_4_;
      fVar263 = fVar236 - fStack_200;
      fVar207 = fVar239 - fStack_1fc;
      fVar131 = (float)local_208._0_4_ * fVar209 - local_178 * fVar217;
      fVar138 = (float)local_208._4_4_ * fVar210 - fStack_174 * fVar218;
      fVar143 = fStack_200 * fVar219 - fStack_170 * fVar263;
      fVar205 = fStack_1fc * fVar224 - fStack_16c * fVar207;
      auVar24._4_4_ = fVar245;
      auVar24._0_4_ = fVar242;
      auVar24._8_4_ = fVar257;
      auVar24._12_4_ = fVar259;
      auVar75 = maxps(_local_398,auVar24);
      bVar63 = fVar131 * fVar131 <=
               auVar75._0_4_ * auVar75._0_4_ * (fVar209 * fVar209 + fVar217 * fVar217) &&
               0.0 < fVar106;
      auVar216._0_4_ = -(uint)bVar63;
      bVar48 = fVar138 * fVar138 <=
               auVar75._4_4_ * auVar75._4_4_ * (fVar210 * fVar210 + fVar218 * fVar218) &&
               1.0 < fVar106;
      auVar216._4_4_ = -(uint)bVar48;
      bVar49 = fVar143 * fVar143 <=
               auVar75._8_4_ * auVar75._8_4_ * (fVar219 * fVar219 + fVar263 * fVar263) &&
               2.0 < fVar106;
      auVar216._8_4_ = -(uint)bVar49;
      bVar50 = fVar205 * fVar205 <=
               auVar75._12_4_ * auVar75._12_4_ * (fVar224 * fVar224 + fVar207 * fVar207) &&
               3.0 < fVar106;
      auVar216._12_4_ = -(uint)bVar50;
      local_2e8 = auVar253._0_4_;
      fStack_2e4 = auVar253._4_4_;
      fStack_2e0 = auVar253._8_4_;
      fStack_2dc = auVar253._12_4_;
      local_2e8 = local_2e8 * 4.7683716e-07;
      iVar53 = movmskps(iVar19,auVar216);
      fVar131 = fStack_380;
      fVar138 = fStack_380;
      fVar143 = fStack_380;
      fVar205 = fStack_360;
      fVar206 = fStack_360;
      fVar211 = fStack_360;
      if (iVar53 == 0) {
        bVar63 = false;
        local_388 = local_358;
        fStack_384 = fVar191;
        local_368 = local_3c8;
        fStack_364 = fVar73;
      }
      else {
        local_188._0_4_ = auVar28._0_4_;
        local_188._4_4_ = auVar28._4_4_;
        fStack_180 = auVar28._8_4_;
        fVar132 = fVar140 * fStack_360 + (float)local_188._0_4_ * fStack_380 + fVar157 * fVar170 +
                  fVar193 * fVar192;
        fVar139 = fVar107 * fStack_360 + (float)local_188._4_4_ * fStack_380 + fVar160 * fVar170 +
                  fVar197 * fVar192;
        fVar141 = fVar108 * fStack_360 + fStack_180 * fStack_380 + fVar168 * fVar170 +
                  fVar198 * fVar192;
        fVar142 = fVar128 * fStack_360 + fVar155 * fStack_380 + fVar169 * fVar170 +
                  fVar199 * fVar192;
        local_2a8._0_4_ = auVar27._0_4_;
        local_2a8._4_4_ = auVar27._4_4_;
        fStack_2a0 = auVar27._8_4_;
        fVar144 = local_3b8 * fStack_360 + (float)local_2a8._0_4_ * fStack_380 + local_3a8 * fVar170
                  + local_348 * fVar192;
        fVar156 = fStack_3b4 * fStack_360 + (float)local_2a8._4_4_ * fStack_380 +
                  fStack_3a4 * fVar170 + fStack_344 * fVar192;
        fVar158 = fStack_3b0 * fStack_360 + fStack_2a0 * fStack_380 + fStack_3a0 * fVar170 +
                  fStack_340 * fVar192;
        fVar159 = fStack_3ac * fStack_360 + fVar126 * fStack_380 + fStack_39c * fVar170 +
                  fStack_33c * fVar192;
        fVar140 = *(float *)(catmullrom_basis0 + lVar23 + 0x1210);
        fVar107 = *(float *)(catmullrom_basis0 + lVar23 + 0x1214);
        fVar108 = *(float *)(catmullrom_basis0 + lVar23 + 0x1218);
        fVar126 = *(float *)(catmullrom_basis0 + lVar23 + 0x121c);
        fVar128 = *(float *)(catmullrom_basis0 + lVar23 + 0x1694);
        fVar155 = *(float *)(catmullrom_basis0 + lVar23 + 0x1698);
        fVar157 = *(float *)(catmullrom_basis0 + lVar23 + 0x169c);
        fVar160 = *(float *)(catmullrom_basis0 + lVar23 + 0x16a0);
        fVar168 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b18);
        fVar169 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b1c);
        fVar193 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b20);
        fVar197 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b24);
        local_3b8 = fVar242;
        fStack_3b4 = fVar245;
        fStack_3b0 = fVar257;
        fStack_3ac = fVar259;
        _local_2a8 = auVar216;
        local_388 = fStack_380;
        fStack_384 = fStack_380;
        fStack_37c = fStack_380;
        fVar198 = *(float *)(catmullrom_basis0 + lVar23 + 0x1f9c);
        fVar199 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa0);
        fVar261 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa4);
        fVar264 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa8);
        local_368 = fStack_360;
        fStack_364 = fStack_360;
        fStack_35c = fStack_360;
        local_348 = fVar217;
        fStack_344 = fVar218;
        fStack_340 = fVar263;
        fStack_33c = fVar207;
        fVar228 = local_1c8 * fVar140 +
                  local_1d8 * fVar128 + local_358 * fVar168 + local_3c8 * fVar198;
        fVar237 = local_1c8 * fVar107 +
                  local_1d8 * fVar155 + local_358 * fVar169 + local_3c8 * fVar199;
        fVar240 = local_1c8 * fVar108 +
                  local_1d8 * fVar157 + local_358 * fVar193 + local_3c8 * fVar261;
        fVar243 = local_1c8 * fVar126 +
                  local_1d8 * fVar160 + local_358 * fVar197 + local_3c8 * fVar264;
        fVar284 = local_1b8 * fVar140 + local_1e8 * fVar128 + fVar191 * fVar168 + fVar73 * fVar198;
        fVar285 = local_1b8 * fVar107 + local_1e8 * fVar155 + fVar191 * fVar169 + fVar73 * fVar199;
        fVar286 = local_1b8 * fVar108 + local_1e8 * fVar157 + fVar191 * fVar193 + fVar73 * fVar261;
        fVar287 = local_1b8 * fVar126 + local_1e8 * fVar160 + fVar191 * fVar197 + fVar73 * fVar264;
        fVar271 = *(float *)(catmullrom_basis1 + lVar23 + 0x1210);
        fVar273 = *(float *)(catmullrom_basis1 + lVar23 + 0x1214);
        fVar275 = *(float *)(catmullrom_basis1 + lVar23 + 0x1218);
        fVar226 = *(float *)(catmullrom_basis1 + lVar23 + 0x121c);
        fVar229 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b18);
        fVar238 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b1c);
        fVar241 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b20);
        fVar244 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b24);
        fVar246 = *(float *)(catmullrom_basis1 + lVar23 + 0x1f9c);
        fVar258 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa0);
        fVar260 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa4);
        fVar262 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa8);
        fVar265 = *(float *)(catmullrom_basis1 + lVar23 + 0x1694);
        fVar272 = *(float *)(catmullrom_basis1 + lVar23 + 0x1698);
        fVar274 = *(float *)(catmullrom_basis1 + lVar23 + 0x169c);
        fVar276 = *(float *)(catmullrom_basis1 + lVar23 + 0x16a0);
        fVar277 = local_1c8 * fVar271 +
                  local_1d8 * fVar265 + local_358 * fVar229 + local_3c8 * fVar246;
        fVar281 = local_1c8 * fVar273 +
                  local_1d8 * fVar272 + local_358 * fVar238 + local_3c8 * fVar258;
        fVar282 = local_1c8 * fVar275 +
                  local_1d8 * fVar274 + local_358 * fVar241 + local_3c8 * fVar260;
        fVar283 = local_1c8 * fVar226 +
                  local_1d8 * fVar276 + local_358 * fVar244 + local_3c8 * fVar262;
        fVar109 = local_1b8 * fVar271 + local_1e8 * fVar265 + fVar191 * fVar229 + fVar73 * fVar246;
        fVar127 = local_1b8 * fVar273 + local_1e8 * fVar272 + fVar191 * fVar238 + fVar73 * fVar258;
        fVar129 = local_1b8 * fVar275 + local_1e8 * fVar274 + fVar191 * fVar241 + fVar73 * fVar260;
        fVar130 = local_1b8 * fVar226 + local_1e8 * fVar276 + fVar191 * fVar244 + fVar73 * fVar262;
        auVar254._0_8_ = CONCAT44(fVar237,fVar228) & 0x7fffffff7fffffff;
        auVar254._8_4_ = ABS(fVar240);
        auVar254._12_4_ = ABS(fVar243);
        auVar97._0_8_ = CONCAT44(fVar285,fVar284) & 0x7fffffff7fffffff;
        auVar97._8_4_ = ABS(fVar286);
        auVar97._12_4_ = ABS(fVar287);
        auVar75 = maxps(auVar254,auVar97);
        auVar266._0_8_ =
             CONCAT44(fVar107 * fVar192 +
                      fVar155 * fVar170 + fVar169 * fStack_380 + fVar199 * fStack_360,
                      fVar140 * fVar192 +
                      fVar128 * fVar170 + fVar168 * fStack_380 + fVar198 * fStack_360) &
             0x7fffffff7fffffff;
        auVar266._8_4_ =
             ABS(fVar108 * fVar192 + fVar157 * fVar170 + fVar193 * fStack_380 + fVar261 * fStack_360
                );
        auVar266._12_4_ =
             ABS(fVar126 * fVar192 + fVar160 * fVar170 + fVar197 * fStack_380 + fVar264 * fStack_360
                );
        auVar75 = maxps(auVar75,auVar266);
        uVar67 = -(uint)(local_2e8 <= auVar75._0_4_);
        uVar68 = -(uint)(local_2e8 <= auVar75._4_4_);
        uVar69 = -(uint)(local_2e8 <= auVar75._8_4_);
        uVar70 = -(uint)(local_2e8 <= auVar75._12_4_);
        fVar128 = (float)((uint)fVar228 & uVar67 | ~uVar67 & (uint)fVar209);
        fVar155 = (float)((uint)fVar237 & uVar68 | ~uVar68 & (uint)fVar210);
        fVar157 = (float)((uint)fVar240 & uVar69 | ~uVar69 & (uint)fVar219);
        fVar160 = (float)((uint)fVar243 & uVar70 | ~uVar70 & (uint)fVar224);
        fVar168 = (float)(~uVar67 & (uint)fVar217 | (uint)fVar284 & uVar67);
        fVar169 = (float)(~uVar68 & (uint)fVar218 | (uint)fVar285 & uVar68);
        fVar193 = (float)(~uVar69 & (uint)fVar263 | (uint)fVar286 & uVar69);
        fVar197 = (float)(~uVar70 & (uint)fVar207 | (uint)fVar287 & uVar70);
        auVar267._0_8_ = CONCAT44(fVar281,fVar277) & 0x7fffffff7fffffff;
        auVar267._8_4_ = ABS(fVar282);
        auVar267._12_4_ = ABS(fVar283);
        auVar208._0_8_ = CONCAT44(fVar127,fVar109) & 0x7fffffff7fffffff;
        auVar208._8_4_ = ABS(fVar129);
        auVar208._12_4_ = ABS(fVar130);
        auVar75 = maxps(auVar267,auVar208);
        auVar195._0_8_ =
             CONCAT44(fVar273 * fVar192 +
                      fVar272 * fVar170 + fVar238 * fStack_380 + fVar258 * fStack_360,
                      fVar271 * fVar192 +
                      fVar265 * fVar170 + fVar229 * fStack_380 + fVar246 * fStack_360) &
             0x7fffffff7fffffff;
        auVar195._8_4_ =
             ABS(fVar275 * fVar192 + fVar274 * fVar170 + fVar241 * fStack_380 + fVar260 * fStack_360
                );
        auVar195._12_4_ =
             ABS(fVar226 * fVar192 + fVar276 * fVar170 + fVar244 * fStack_380 + fVar262 * fStack_360
                );
        auVar75 = maxps(auVar75,auVar195);
        uVar67 = -(uint)(local_2e8 <= auVar75._0_4_);
        uVar68 = -(uint)(local_2e8 <= auVar75._4_4_);
        uVar69 = -(uint)(local_2e8 <= auVar75._8_4_);
        uVar70 = -(uint)(local_2e8 <= auVar75._12_4_);
        fVar209 = (float)((uint)fVar277 & uVar67 | ~uVar67 & (uint)fVar209);
        fVar210 = (float)((uint)fVar281 & uVar68 | ~uVar68 & (uint)fVar210);
        fVar229 = (float)((uint)fVar282 & uVar69 | ~uVar69 & (uint)fVar219);
        fVar238 = (float)((uint)fVar283 & uVar70 | ~uVar70 & (uint)fVar224);
        auVar122._0_4_ = (uint)fVar109 & uVar67;
        auVar122._4_4_ = (uint)fVar127 & uVar68;
        auVar122._8_4_ = (uint)fVar129 & uVar69;
        auVar122._12_4_ = (uint)fVar130 & uVar70;
        auVar268._0_4_ = ~uVar67 & (uint)fVar217;
        auVar268._4_4_ = ~uVar68 & (uint)fVar218;
        auVar268._8_4_ = ~uVar69 & (uint)fVar263;
        auVar268._12_4_ = ~uVar70 & (uint)fVar207;
        auVar268 = auVar268 | auVar122;
        auVar98._0_4_ = fVar168 * fVar168 + fVar128 * fVar128;
        auVar98._4_4_ = fVar169 * fVar169 + fVar155 * fVar155;
        auVar98._8_4_ = fVar193 * fVar193 + fVar157 * fVar157;
        auVar98._12_4_ = fVar197 * fVar197 + fVar160 * fVar160;
        auVar75 = rsqrtps(auVar122,auVar98);
        fVar140 = auVar75._0_4_;
        fVar107 = auVar75._4_4_;
        fVar108 = auVar75._8_4_;
        fVar126 = auVar75._12_4_;
        auVar123._0_4_ = fVar140 * fVar140 * auVar98._0_4_ * 0.5 * fVar140;
        auVar123._4_4_ = fVar107 * fVar107 * auVar98._4_4_ * 0.5 * fVar107;
        auVar123._8_4_ = fVar108 * fVar108 * auVar98._8_4_ * 0.5 * fVar108;
        auVar123._12_4_ = fVar126 * fVar126 * auVar98._12_4_ * 0.5 * fVar126;
        fVar263 = fVar140 * 1.5 - auVar123._0_4_;
        fVar207 = fVar107 * 1.5 - auVar123._4_4_;
        fVar271 = fVar108 * 1.5 - auVar123._8_4_;
        fVar273 = fVar126 * 1.5 - auVar123._12_4_;
        fVar198 = auVar268._0_4_;
        fVar199 = auVar268._4_4_;
        fVar217 = auVar268._8_4_;
        fVar218 = auVar268._12_4_;
        auVar99._0_4_ = fVar198 * fVar198 + fVar209 * fVar209;
        auVar99._4_4_ = fVar199 * fVar199 + fVar210 * fVar210;
        auVar99._8_4_ = fVar217 * fVar217 + fVar229 * fVar229;
        auVar99._12_4_ = fVar218 * fVar218 + fVar238 * fVar238;
        auVar75 = rsqrtps(auVar123,auVar99);
        fVar140 = auVar75._0_4_;
        fVar107 = auVar75._4_4_;
        fVar108 = auVar75._8_4_;
        fVar126 = auVar75._12_4_;
        fVar140 = fVar140 * 1.5 - fVar140 * fVar140 * auVar99._0_4_ * 0.5 * fVar140;
        fVar107 = fVar107 * 1.5 - fVar107 * fVar107 * auVar99._4_4_ * 0.5 * fVar107;
        fVar108 = fVar108 * 1.5 - fVar108 * fVar108 * auVar99._8_4_ * 0.5 * fVar108;
        fVar126 = fVar126 * 1.5 - fVar126 * fVar126 * auVar99._12_4_ * 0.5 * fVar126;
        fVar219 = fVar168 * fVar263 * (float)local_398._0_4_;
        fVar224 = fVar169 * fVar207 * (float)local_398._4_4_;
        fVar261 = fVar193 * fVar271 * fStack_390;
        fVar264 = fVar197 * fVar273 * fStack_38c;
        fVar128 = -fVar128 * fVar263 * (float)local_398._0_4_;
        fVar155 = -fVar155 * fVar207 * (float)local_398._4_4_;
        fVar157 = -fVar157 * fVar271 * fStack_390;
        fVar160 = -fVar160 * fVar273 * fStack_38c;
        fVar109 = fVar263 * 0.0 * (float)local_398._0_4_;
        fVar127 = fVar207 * 0.0 * (float)local_398._4_4_;
        fVar129 = fVar271 * 0.0 * fStack_390;
        fVar130 = fVar273 * 0.0 * fStack_38c;
        local_3a8 = fVar144 + fVar109;
        fStack_3a4 = fVar156 + fVar127;
        fStack_3a0 = fVar158 + fVar129;
        fStack_39c = fVar159 + fVar130;
        fVar265 = fVar198 * fVar140 * fVar242;
        fVar272 = fVar199 * fVar107 * fVar245;
        fVar274 = fVar217 * fVar108 * fVar257;
        fVar276 = fVar218 * fVar126 * fVar259;
        fVar271 = (float)local_2f8._0_4_ + fVar265;
        fVar273 = (float)local_2f8._4_4_ + fVar272;
        fVar275 = fStack_2f0 + fVar274;
        fVar226 = fStack_2ec + fVar276;
        fVar199 = -fVar209 * fVar140 * fVar242;
        fVar218 = -fVar210 * fVar107 * fVar245;
        fVar207 = -fVar229 * fVar108 * fVar257;
        fVar210 = -fVar238 * fVar126 * fVar259;
        fVar229 = fVar225 + fVar199;
        fVar238 = fVar227 + fVar218;
        fVar241 = fVar236 + fVar207;
        fVar244 = fVar239 + fVar210;
        fVar168 = fVar140 * 0.0 * fVar242;
        fVar169 = fVar107 * 0.0 * fVar245;
        fVar193 = fVar108 * 0.0 * fVar257;
        fVar197 = fVar126 * 0.0 * fVar259;
        fVar140 = local_178 - fVar219;
        fVar107 = fStack_174 - fVar224;
        fVar108 = fStack_170 - fVar261;
        fVar126 = fStack_16c - fVar264;
        fVar246 = fVar132 + fVar168;
        fVar258 = fVar139 + fVar169;
        fVar260 = fVar141 + fVar193;
        fVar262 = fVar142 + fVar197;
        fVar198 = (float)local_208._0_4_ - fVar128;
        fVar217 = (float)local_208._4_4_ - fVar155;
        fVar263 = fStack_200 - fVar157;
        fVar209 = fStack_1fc - fVar160;
        fVar144 = fVar144 - fVar109;
        fVar156 = fVar156 - fVar127;
        fVar158 = fVar158 - fVar129;
        fVar159 = fVar159 - fVar130;
        uVar67 = -(uint)(0.0 < (fVar198 * (fVar246 - fVar144) - fVar144 * (fVar229 - fVar198)) * 0.0
                               + (fVar144 * (fVar271 - fVar140) - (fVar246 - fVar144) * fVar140) *
                                 0.0 + ((fVar229 - fVar198) * fVar140 -
                                       (fVar271 - fVar140) * fVar198));
        uVar68 = -(uint)(0.0 < (fVar217 * (fVar258 - fVar156) - fVar156 * (fVar238 - fVar217)) * 0.0
                               + (fVar156 * (fVar273 - fVar107) - (fVar258 - fVar156) * fVar107) *
                                 0.0 + ((fVar238 - fVar217) * fVar107 -
                                       (fVar273 - fVar107) * fVar217));
        uVar69 = -(uint)(0.0 < (fVar263 * (fVar260 - fVar158) - fVar158 * (fVar241 - fVar263)) * 0.0
                               + (fVar158 * (fVar275 - fVar108) - (fVar260 - fVar158) * fVar108) *
                                 0.0 + ((fVar241 - fVar263) * fVar108 -
                                       (fVar275 - fVar108) * fVar263));
        uVar70 = -(uint)(0.0 < (fVar209 * (fVar262 - fVar159) - fVar159 * (fVar244 - fVar209)) * 0.0
                               + (fVar159 * (fVar226 - fVar126) - (fVar262 - fVar159) * fVar126) *
                                 0.0 + ((fVar244 - fVar209) * fVar126 -
                                       (fVar226 - fVar126) * fVar209));
        fVar219 = (float)((uint)((float)local_2f8._0_4_ - fVar265) & uVar67 |
                         ~uVar67 & (uint)(local_178 + fVar219));
        fVar224 = (float)((uint)((float)local_2f8._4_4_ - fVar272) & uVar68 |
                         ~uVar68 & (uint)(fStack_174 + fVar224));
        fVar261 = (float)((uint)(fStack_2f0 - fVar274) & uVar69 |
                         ~uVar69 & (uint)(fStack_170 + fVar261));
        fVar264 = (float)((uint)(fStack_2ec - fVar276) & uVar70 |
                         ~uVar70 & (uint)(fStack_16c + fVar264));
        fVar225 = (float)((uint)(fVar225 - fVar199) & uVar67 |
                         ~uVar67 & (uint)((float)local_208._0_4_ + fVar128));
        fVar227 = (float)((uint)(fVar227 - fVar218) & uVar68 |
                         ~uVar68 & (uint)((float)local_208._4_4_ + fVar155));
        fStack_3d0 = (float)((uint)(fVar236 - fVar207) & uVar69 |
                            ~uVar69 & (uint)(fStack_200 + fVar157));
        fStack_3cc = (float)((uint)(fVar239 - fVar210) & uVar70 |
                            ~uVar70 & (uint)(fStack_1fc + fVar160));
        fVar274 = (float)((uint)(fVar132 - fVar168) & uVar67 | ~uVar67 & (uint)local_3a8);
        fVar276 = (float)((uint)(fVar139 - fVar169) & uVar68 | ~uVar68 & (uint)fStack_3a4);
        fVar109 = (float)((uint)(fVar141 - fVar193) & uVar69 | ~uVar69 & (uint)fStack_3a0);
        fVar127 = (float)((uint)(fVar142 - fVar197) & uVar70 | ~uVar70 & (uint)fStack_39c);
        fVar128 = (float)((uint)fVar140 & uVar67 | ~uVar67 & (uint)fVar271);
        fVar155 = (float)((uint)fVar107 & uVar68 | ~uVar68 & (uint)fVar273);
        fVar157 = (float)((uint)fVar108 & uVar69 | ~uVar69 & (uint)fVar275);
        fVar160 = (float)((uint)fVar126 & uVar70 | ~uVar70 & (uint)fVar226);
        fVar199 = (float)((uint)fVar198 & uVar67 | ~uVar67 & (uint)fVar229);
        fVar218 = (float)((uint)fVar217 & uVar68 | ~uVar68 & (uint)fVar238);
        fVar207 = (float)((uint)fVar263 & uVar69 | ~uVar69 & (uint)fVar241);
        fVar210 = (float)((uint)fVar209 & uVar70 | ~uVar70 & (uint)fVar244);
        fVar168 = (float)((uint)fVar144 & uVar67 | ~uVar67 & (uint)fVar246);
        fVar169 = (float)((uint)fVar156 & uVar68 | ~uVar68 & (uint)fVar258);
        fVar193 = (float)((uint)fVar158 & uVar69 | ~uVar69 & (uint)fVar260);
        fVar197 = (float)((uint)fVar159 & uVar70 | ~uVar70 & (uint)fVar262);
        fVar236 = (float)((uint)fVar271 & uVar67 | ~uVar67 & (uint)fVar140) - fVar219;
        fVar239 = (float)((uint)fVar273 & uVar68 | ~uVar68 & (uint)fVar107) - fVar224;
        fVar271 = (float)((uint)fVar275 & uVar69 | ~uVar69 & (uint)fVar108) - fVar261;
        fVar273 = (float)((uint)fVar226 & uVar70 | ~uVar70 & (uint)fVar126) - fVar264;
        fVar275 = (float)((uint)fVar229 & uVar67 | ~uVar67 & (uint)fVar198) - fVar225;
        fVar226 = (float)((uint)fVar238 & uVar68 | ~uVar68 & (uint)fVar217) - fVar227;
        fVar229 = (float)((uint)fVar241 & uVar69 | ~uVar69 & (uint)fVar263) - fStack_3d0;
        fVar238 = (float)((uint)fVar244 & uVar70 | ~uVar70 & (uint)fVar209) - fStack_3cc;
        fVar241 = (float)((uint)fVar246 & uVar67 | ~uVar67 & (uint)fVar144) - fVar274;
        fVar244 = (float)((uint)fVar258 & uVar68 | ~uVar68 & (uint)fVar156) - fVar276;
        fVar246 = (float)((uint)fVar260 & uVar69 | ~uVar69 & (uint)fVar158) - fVar109;
        fVar258 = (float)((uint)fVar262 & uVar70 | ~uVar70 & (uint)fVar159) - fVar127;
        fVar129 = fVar219 - fVar128;
        fVar130 = fVar224 - fVar155;
        fVar132 = fVar261 - fVar157;
        fVar139 = fVar264 - fVar160;
        fVar198 = fVar225 - fVar199;
        fVar217 = fVar227 - fVar218;
        fVar263 = fStack_3d0 - fVar207;
        fVar209 = fStack_3cc - fVar210;
        local_3d8 = CONCAT44(fVar227,fVar225);
        fVar140 = fVar274 - fVar168;
        fVar107 = fVar276 - fVar169;
        fVar108 = fVar109 - fVar193;
        fVar126 = fVar127 - fVar197;
        fVar260 = (fVar225 * fVar241 - fVar274 * fVar275) * 0.0 +
                  (fVar274 * fVar236 - fVar219 * fVar241) * 0.0 +
                  (fVar219 * fVar275 - fVar225 * fVar236);
        fVar262 = (fVar227 * fVar244 - fVar276 * fVar226) * 0.0 +
                  (fVar276 * fVar239 - fVar224 * fVar244) * 0.0 +
                  (fVar224 * fVar226 - fVar227 * fVar239);
        auVar151._4_4_ = fVar262;
        auVar151._0_4_ = fVar260;
        fVar265 = (fStack_3d0 * fVar246 - fVar109 * fVar229) * 0.0 +
                  (fVar109 * fVar271 - fVar261 * fVar246) * 0.0 +
                  (fVar261 * fVar229 - fStack_3d0 * fVar271);
        fVar272 = (fStack_3cc * fVar258 - fVar127 * fVar238) * 0.0 +
                  (fVar127 * fVar273 - fVar264 * fVar258) * 0.0 +
                  (fVar264 * fVar238 - fStack_3cc * fVar273);
        auVar278._0_4_ =
             (fVar199 * fVar140 - fVar168 * fVar198) * 0.0 +
             (fVar168 * fVar129 - fVar128 * fVar140) * 0.0 + (fVar128 * fVar198 - fVar199 * fVar129)
        ;
        auVar278._4_4_ =
             (fVar218 * fVar107 - fVar169 * fVar217) * 0.0 +
             (fVar169 * fVar130 - fVar155 * fVar107) * 0.0 + (fVar155 * fVar217 - fVar218 * fVar130)
        ;
        auVar278._8_4_ =
             (fVar207 * fVar108 - fVar193 * fVar263) * 0.0 +
             (fVar193 * fVar132 - fVar157 * fVar108) * 0.0 + (fVar157 * fVar263 - fVar207 * fVar132)
        ;
        auVar278._12_4_ =
             (fVar210 * fVar126 - fVar197 * fVar209) * 0.0 +
             (fVar197 * fVar139 - fVar160 * fVar126) * 0.0 + (fVar160 * fVar209 - fVar210 * fVar139)
        ;
        auVar151._8_4_ = fVar265;
        auVar151._12_4_ = fVar272;
        auVar75 = maxps(auVar151,auVar278);
        bVar63 = auVar75._0_4_ <= 0.0 && bVar63;
        auVar152._0_4_ = -(uint)bVar63;
        bVar48 = auVar75._4_4_ <= 0.0 && bVar48;
        auVar152._4_4_ = -(uint)bVar48;
        bVar49 = auVar75._8_4_ <= 0.0 && bVar49;
        auVar152._8_4_ = -(uint)bVar49;
        bVar50 = auVar75._12_4_ <= 0.0 && bVar50;
        auVar152._12_4_ = -(uint)bVar50;
        iVar53 = movmskps(iVar53,auVar152);
        if (iVar53 == 0) {
LAB_00b48c40:
          iVar53 = 0;
          auVar101._8_8_ = uStack_300;
          auVar101._0_8_ = local_308;
        }
        else {
          fVar128 = local_370->tfar;
          auVar100._0_4_ = fVar140 * fVar275;
          auVar100._4_4_ = fVar107 * fVar226;
          auVar100._8_4_ = fVar108 * fVar229;
          auVar100._12_4_ = fVar126 * fVar238;
          fVar169 = fVar198 * fVar241 - auVar100._0_4_;
          fVar193 = fVar217 * fVar244 - auVar100._4_4_;
          fVar197 = fVar263 * fVar246 - auVar100._8_4_;
          fVar199 = fVar209 * fVar258 - auVar100._12_4_;
          fVar155 = fVar140 * fVar236 - fVar241 * fVar129;
          fVar157 = fVar107 * fVar239 - fVar244 * fVar130;
          fVar160 = fVar108 * fVar271 - fVar246 * fVar132;
          fVar168 = fVar126 * fVar273 - fVar258 * fVar139;
          fVar198 = fVar129 * fVar275 - fVar198 * fVar236;
          fVar217 = fVar130 * fVar226 - fVar217 * fVar239;
          fVar218 = fVar132 * fVar229 - fVar263 * fVar271;
          fVar263 = fVar139 * fVar238 - fVar209 * fVar273;
          auVar187._0_4_ = fVar169 * 0.0 + fVar155 * 0.0 + fVar198;
          auVar187._4_4_ = fVar193 * 0.0 + fVar157 * 0.0 + fVar217;
          auVar187._8_4_ = fVar197 * 0.0 + fVar160 * 0.0 + fVar218;
          auVar187._12_4_ = fVar199 * 0.0 + fVar168 * 0.0 + fVar263;
          auVar75 = rcpps(auVar100,auVar187);
          fVar140 = auVar75._0_4_;
          fVar107 = auVar75._4_4_;
          fVar108 = auVar75._8_4_;
          fVar126 = auVar75._12_4_;
          fVar140 = (1.0 - auVar187._0_4_ * fVar140) * fVar140 + fVar140;
          fVar107 = (1.0 - auVar187._4_4_ * fVar107) * fVar107 + fVar107;
          fVar108 = (1.0 - auVar187._8_4_ * fVar108) * fVar108 + fVar108;
          fVar126 = (1.0 - auVar187._12_4_ * fVar126) * fVar126 + fVar126;
          fVar155 = (fVar274 * fVar198 + fVar225 * fVar155 + fVar219 * fVar169) * fVar140;
          fVar157 = (fVar276 * fVar217 + fVar227 * fVar157 + fVar224 * fVar193) * fVar107;
          fVar160 = (fVar109 * fVar218 + fStack_3d0 * fVar160 + fVar261 * fVar197) * fVar108;
          fVar168 = (fVar127 * fVar263 + fStack_3cc * fVar168 + fVar264 * fVar199) * fVar126;
          bVar63 = (fVar155 <= fVar128 && fStack_1ec <= fVar155) && bVar63;
          auVar162._0_4_ = -(uint)bVar63;
          bVar48 = (fVar157 <= fVar128 && fStack_1ec <= fVar157) && bVar48;
          auVar162._4_4_ = -(uint)bVar48;
          bVar49 = (fVar160 <= fVar128 && fStack_1ec <= fVar160) && bVar49;
          auVar162._8_4_ = -(uint)bVar49;
          bVar50 = (fVar168 <= fVar128 && fStack_1ec <= fVar168) && bVar50;
          auVar162._12_4_ = -(uint)bVar50;
          iVar53 = movmskps(iVar53,auVar162);
          if (iVar53 == 0) goto LAB_00b48c40;
          auVar163._0_8_ =
               CONCAT44(-(uint)(auVar187._4_4_ != 0.0 && bVar48),
                        -(uint)(auVar187._0_4_ != 0.0 && bVar63));
          auVar163._8_4_ = -(uint)(auVar187._8_4_ != 0.0 && bVar49);
          auVar163._12_4_ = -(uint)(auVar187._12_4_ != 0.0 && bVar50);
          iVar53 = movmskps(iVar53,auVar163);
          auVar101._8_8_ = uStack_300;
          auVar101._0_8_ = local_308;
          if (iVar53 != 0) {
            fVar260 = fVar260 * fVar140;
            fVar262 = fVar262 * fVar107;
            fVar265 = fVar265 * fVar108;
            fVar272 = fVar272 * fVar126;
            local_328 = (float)((uint)(1.0 - fVar260) & uVar67 | ~uVar67 & (uint)fVar260);
            fStack_324 = (float)((uint)(1.0 - fVar262) & uVar68 | ~uVar68 & (uint)fVar262);
            fStack_320 = (float)((uint)(1.0 - fVar265) & uVar69 | ~uVar69 & (uint)fVar265);
            fStack_31c = (float)((uint)(1.0 - fVar272) & uVar70 | ~uVar70 & (uint)fVar272);
            auVar101._8_4_ = auVar163._8_4_;
            auVar101._0_8_ = auVar163._0_8_;
            auVar101._12_4_ = auVar163._12_4_;
            local_198 = (float)(~uVar67 & (uint)(auVar278._0_4_ * fVar140) |
                               (uint)(1.0 - auVar278._0_4_ * fVar140) & uVar67);
            fStack_194 = (float)(~uVar68 & (uint)(auVar278._4_4_ * fVar107) |
                                (uint)(1.0 - auVar278._4_4_ * fVar107) & uVar68);
            fStack_190 = (float)(~uVar69 & (uint)(auVar278._8_4_ * fVar108) |
                                (uint)(1.0 - auVar278._8_4_ * fVar108) & uVar69);
            fStack_18c = (float)(~uVar70 & (uint)(auVar278._12_4_ * fVar126) |
                                (uint)(1.0 - auVar278._12_4_ * fVar126) & uVar70);
            local_338 = fVar155;
            fStack_334 = fVar157;
            fStack_330 = fVar160;
            fStack_32c = fVar168;
          }
        }
        iVar53 = movmskps(iVar53,auVar101);
        if (iVar53 == 0) {
          bVar63 = false;
        }
        else {
          fVar107 = (fVar242 - (float)local_398._0_4_) * local_328 + (float)local_398._0_4_;
          fVar108 = (fVar245 - (float)local_398._4_4_) * fStack_324 + (float)local_398._4_4_;
          fVar126 = (fVar257 - fStack_390) * fStack_320 + fStack_390;
          fVar128 = (fVar259 - fStack_38c) * fStack_31c + fStack_38c;
          fVar140 = local_310->depth_scale;
          auVar124._0_4_ = -(uint)(fVar140 * (fVar107 + fVar107) < local_338) & auVar101._0_4_;
          auVar124._4_4_ = -(uint)(fVar140 * (fVar108 + fVar108) < fStack_334) & auVar101._4_4_;
          auVar124._8_4_ = -(uint)(fVar140 * (fVar126 + fVar126) < fStack_330) & auVar101._8_4_;
          auVar124._12_4_ = -(uint)(fVar140 * (fVar128 + fVar128) < fStack_32c) & auVar101._12_4_;
          uVar67 = movmskps((int)local_310,auVar124);
          if (uVar67 != 0) {
            local_198 = local_198 + local_198 + -1.0;
            fStack_194 = fStack_194 + fStack_194 + -1.0;
            fStack_190 = fStack_190 + fStack_190 + -1.0;
            fStack_18c = fStack_18c + fStack_18c + -1.0;
            local_128 = local_328;
            fStack_124 = fStack_324;
            fStack_120 = fStack_320;
            fStack_11c = fStack_31c;
            local_118 = local_198;
            fStack_114 = fStack_194;
            fStack_110 = fStack_190;
            fStack_10c = fStack_18c;
            local_108 = local_338;
            fStack_104 = fStack_334;
            fStack_100 = fStack_330;
            fStack_fc = fStack_32c;
            local_f8 = 0;
            local_f4 = iVar19;
            local_e8 = CONCAT44(fStack_224,local_228);
            uStack_e0 = CONCAT44(fStack_21c,fStack_220);
            local_d8 = CONCAT44(fStack_234,local_238);
            uStack_d0 = CONCAT44(fStack_22c,fStack_230);
            local_c8 = CONCAT44(fStack_244,local_248);
            uStack_c0 = CONCAT44(fStack_23c,fStack_240);
            local_b8 = CONCAT44(fStack_214,local_218);
            uStack_b0 = CONCAT44(fStack_20c,fStack_210);
            local_a8 = auVar124;
            pRVar58 = (RTCIntersectArguments *)(ulong)(uint)local_370->mask;
            if ((pGVar20->mask & local_370->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar63 = true, pRVar58 = context->args,
                 pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar106 = 1.0 / fVar106;
                local_98[0] = fVar106 * (local_328 + 0.0);
                local_98[1] = fVar106 * (fStack_324 + 1.0);
                local_98[2] = fVar106 * (fStack_320 + 2.0);
                local_98[3] = fVar106 * (fStack_31c + 3.0);
                local_88 = CONCAT44(fStack_194,local_198);
                uStack_80 = CONCAT44(fStack_18c,fStack_190);
                local_78[0] = local_338;
                local_78[1] = fStack_334;
                local_78[2] = fStack_330;
                local_78[3] = fStack_32c;
                uVar55 = (ulong)(uVar67 & 0xff);
                pRVar58 = (RTCIntersectArguments *)0x0;
                if (uVar55 != 0) {
                  for (; ((uVar67 & 0xff) >> (long)pRVar58 & 1) == 0;
                      pRVar58 = (RTCIntersectArguments *)((long)&pRVar58->flags + 1)) {
                  }
                }
                local_3d8 = CONCAT44(fVar227,local_370->tfar);
                do {
                  local_28c = local_98[(long)pRVar58];
                  local_288 = *(undefined4 *)((long)&local_88 + (long)pRVar58 * 4);
                  local_370->tfar = local_78[(long)pRVar58];
                  fVar140 = 1.0 - local_28c;
                  fVar107 = local_28c * 3.0;
                  fVar108 = ((fVar107 + 2.0) * (fVar140 + fVar140) + fVar140 * -3.0 * fVar140) * 0.5
                  ;
                  fVar106 = (fVar140 * -2.0 * local_28c + local_28c * local_28c) * 0.5;
                  fVar107 = (local_28c * fVar107 + (fVar107 + -5.0) * (local_28c + local_28c)) * 0.5
                  ;
                  fVar140 = (local_28c * (fVar140 + fVar140) - fVar140 * fVar140) * 0.5;
                  local_2d8._16_8_ = context->user;
                  local_298 = (RTCFilterFunctionN)
                              CONCAT44(fVar140 * fStack_224 +
                                       fVar107 * fStack_234 +
                                       fVar108 * fStack_244 + fVar106 * fStack_214,
                                       fVar140 * local_228 +
                                       fVar107 * local_238 +
                                       fVar108 * local_248 + fVar106 * local_218);
                  local_290 = fVar140 * fStack_220 +
                              fVar107 * fStack_230 + fVar108 * fStack_240 + fVar106 * fStack_210;
                  local_284 = (int)local_260;
                  local_280 = (int)local_318;
                  local_27c = *(uint *)&(((Device *)local_2d8._16_8_)->super_State).super_RefCount.
                                        _vptr_RefCount;
                  local_278 = *(uint *)((long)&(((Device *)local_2d8._16_8_)->super_State).
                                               super_RefCount._vptr_RefCount + 4);
                  local_3fc = -1;
                  local_2d8._0_8_ = &local_3fc;
                  local_2d8._8_8_ = pGVar20->userPtr;
                  local_2d8._24_8_ = local_370;
                  local_2d8._32_8_ = &local_298;
                  local_2b0 = 1.4013e-45;
                  if (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b47c36:
                    pRVar59 = context->args;
                    if ((pRVar59->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar59->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar64 = (undefined1  [8])local_2d8;
                      (*pRVar59->filter)((RTCFilterFunctionNArguments *)auVar64);
                      if (*(int *)local_2d8._0_8_ == 0) goto LAB_00b47c77;
                    }
                    bVar63 = true;
                    pRVar58 = pRVar59;
                    fVar131 = local_388;
                    fVar138 = fStack_384;
                    fVar143 = fStack_37c;
                    fVar205 = local_368;
                    fVar206 = fStack_364;
                    fVar211 = fStack_35c;
                    break;
                  }
                  auVar64 = (undefined1  [8])local_2d8;
                  (*pGVar20->occlusionFilterN)((RTCFilterFunctionNArguments *)auVar64);
                  if (*(int *)local_2d8._0_8_ != 0) goto LAB_00b47c36;
LAB_00b47c77:
                  local_370->tfar = (float)local_3d8;
                  uVar55 = uVar55 ^ 1L << ((ulong)pRVar58 & 0x3f);
                  pRVar58 = (RTCIntersectArguments *)0x0;
                  if (uVar55 != 0) {
                    for (; (uVar55 >> (long)pRVar58 & 1) == 0;
                        pRVar58 = (RTCIntersectArguments *)((long)&pRVar58->flags + 1)) {
                    }
                  }
                  bVar63 = false;
                  fVar131 = local_388;
                  fVar138 = fStack_384;
                  fVar143 = fStack_37c;
                  fVar205 = local_368;
                  fVar206 = fStack_364;
                  fVar211 = fStack_35c;
                } while (uVar55 != 0);
              }
              goto LAB_00b47d56;
            }
          }
          bVar63 = false;
        }
      }
LAB_00b47d56:
      uVar56 = SUB84(pRVar58,0);
      ray = local_370;
      if (4 < iVar19) {
        local_368 = fVar205;
        fStack_364 = fVar206;
        fStack_35c = fVar211;
        local_388 = fVar131;
        fStack_384 = fVar138;
        fStack_37c = fVar143;
        local_58 = iVar19;
        iStack_54 = iVar19;
        iStack_50 = iVar19;
        iStack_4c = iVar19;
        local_1f8 = fStack_1ec;
        fStack_1f4 = fStack_1ec;
        fStack_1f0 = fStack_1ec;
        local_68 = 1.0 / (float)local_258._0_4_;
        fStack_64 = local_68;
        fStack_60 = local_68;
        fStack_5c = local_68;
        lVar65 = 4;
        fStack_2e4 = local_2e8;
        fStack_2e0 = local_2e8;
        fStack_2dc = local_2e8;
        fVar140 = local_358;
        fVar106 = fStack_354;
        fVar107 = fStack_350;
        fVar108 = fStack_34c;
        do {
          uVar68 = (uint)lVar65;
          puVar60 = catmullrom_basis0 + lVar23;
          pfVar1 = (float *)(puVar60 + lVar65 * 4);
          local_3b8 = *pfVar1;
          fStack_3b4 = pfVar1[1];
          fStack_3b0 = pfVar1[2];
          fStack_3ac = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b37f0 + lVar65 * 4);
          local_3a8 = *pfVar1;
          fStack_3a4 = pfVar1[1];
          fStack_3a0 = pfVar1[2];
          fStack_39c = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b3c74 + lVar65 * 4);
          local_348 = *pfVar1;
          fStack_344 = pfVar1[1];
          fStack_340 = pfVar1[2];
          fStack_33c = pfVar1[3];
          pauVar8 = (undefined1 (*) [16])(lVar23 + 0x21b40f8 + lVar65 * 4);
          fVar126 = *(float *)*pauVar8;
          fVar128 = *(float *)(*pauVar8 + 4);
          fVar131 = *(float *)(*pauVar8 + 8);
          auVar27 = *(undefined1 (*) [12])*pauVar8;
          fVar138 = *(float *)(*pauVar8 + 0xc);
          _local_398 = *pauVar8;
          local_2a8._0_4_ =
               local_1c8 * local_3b8 +
               local_1d8 * local_3a8 + fVar140 * local_348 + local_3c8 * fVar126;
          local_2a8._4_4_ =
               fStack_1c4 * fStack_3b4 +
               fStack_1d4 * fStack_3a4 + fVar106 * fStack_344 + fStack_3c4 * fVar128;
          fStack_2a0 = fStack_1c0 * fStack_3b0 +
                       fStack_1d0 * fStack_3a0 + fVar107 * fStack_340 + fStack_3c0 * fVar131;
          fStack_29c = fStack_1bc * fStack_3ac +
                       fStack_1cc * fStack_39c + fVar108 * fStack_33c + fStack_3bc * fVar138;
          local_178 = local_1b8 * local_3b8 +
                      local_1e8 * local_3a8 + fVar191 * local_348 + fVar73 * fVar126;
          fStack_174 = fStack_1b4 * fStack_3b4 +
                       fStack_1e4 * fStack_3a4 + fVar191 * fStack_344 + fVar73 * fVar128;
          fStack_170 = fStack_1b0 * fStack_3b0 +
                       fStack_1e0 * fStack_3a0 + fVar191 * fStack_340 + fVar73 * fVar131;
          fStack_16c = fStack_1ac * fStack_3ac +
                       fStack_1dc * fStack_39c + fVar191 * fStack_33c + fVar73 * fVar138;
          local_2f8._0_4_ =
               local_168 * local_3b8 +
               local_158 * local_3a8 + local_138 * local_348 + local_148 * fVar126;
          local_2f8._4_4_ =
               fStack_164 * fStack_3b4 +
               fStack_154 * fStack_3a4 + fStack_134 * fStack_344 + fStack_144 * fVar128;
          fStack_2f0 = fStack_160 * fStack_3b0 +
                       fStack_150 * fStack_3a0 + fStack_130 * fStack_340 + fStack_140 * fVar131;
          fStack_2ec = fStack_15c * fStack_3ac +
                       fStack_14c * fStack_39c + fStack_12c * fStack_33c + fStack_13c * fVar138;
          pfVar1 = (float *)(catmullrom_basis1 + lVar23 + lVar65 * 4);
          fVar126 = *pfVar1;
          fVar128 = pfVar1[1];
          fVar131 = pfVar1[2];
          fVar143 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b5c10 + lVar65 * 4);
          fVar155 = *pfVar1;
          fVar157 = pfVar1[1];
          fVar160 = pfVar1[2];
          fVar168 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b6094 + lVar65 * 4);
          fVar169 = *pfVar1;
          fVar193 = pfVar1[1];
          fVar197 = pfVar1[2];
          fVar198 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b6518 + lVar65 * 4);
          fVar199 = *pfVar1;
          fVar205 = pfVar1[1];
          local_3d8 = *(ulong *)pfVar1;
          fStack_3d0 = pfVar1[2];
          fStack_3cc = pfVar1[3];
          fVar236 = local_1c8 * fVar126 +
                    local_1d8 * fVar155 + fVar140 * fVar169 + local_3c8 * fVar199;
          fVar239 = fStack_1c4 * fVar128 +
                    fStack_1d4 * fVar157 + fVar106 * fVar193 + fStack_3c4 * fVar205;
          fVar242 = fStack_1c0 * fVar131 +
                    fStack_1d0 * fVar160 + fVar107 * fVar197 + fStack_3c0 * fStack_3d0;
          fVar245 = fStack_1bc * fVar143 +
                    fStack_1cc * fVar168 + fVar108 * fVar198 + fStack_3bc * fStack_3cc;
          fVar219 = local_1b8 * fVar126 + local_1e8 * fVar155 + fVar191 * fVar169 + fVar73 * fVar199
          ;
          fVar224 = fStack_1b4 * fVar128 +
                    fStack_1e4 * fVar157 + fVar191 * fVar193 + fVar73 * fVar205;
          fVar225 = fStack_1b0 * fVar131 +
                    fStack_1e0 * fVar160 + fVar191 * fVar197 + fVar73 * fStack_3d0;
          fVar227 = fStack_1ac * fVar143 +
                    fStack_1dc * fVar168 + fVar191 * fVar198 + fVar73 * fStack_3cc;
          auVar255._0_4_ =
               local_168 * fVar126 + local_158 * fVar155 + local_138 * fVar169 + local_148 * fVar199
          ;
          auVar255._4_4_ =
               fStack_164 * fVar128 +
               fStack_154 * fVar157 + fStack_134 * fVar193 + fStack_144 * fVar205;
          auVar255._8_4_ =
               fStack_160 * fVar131 +
               fStack_150 * fVar160 + fStack_130 * fVar197 + fStack_140 * fStack_3d0;
          auVar255._12_4_ =
               fStack_15c * fVar143 +
               fStack_14c * fVar168 + fStack_12c * fVar198 + fStack_13c * fStack_3cc;
          fVar263 = fVar236 - (float)local_2a8._0_4_;
          fVar207 = fVar239 - (float)local_2a8._4_4_;
          fVar209 = fVar242 - fStack_2a0;
          fVar210 = fVar245 - fStack_29c;
          fVar206 = fVar219 - local_178;
          fVar211 = fVar224 - fStack_174;
          fVar217 = fVar225 - fStack_170;
          fVar218 = fVar227 - fStack_16c;
          fVar257 = local_178 * fVar263 - (float)local_2a8._0_4_ * fVar206;
          fVar259 = fStack_174 * fVar207 - (float)local_2a8._4_4_ * fVar211;
          fVar261 = fStack_170 * fVar209 - fStack_2a0 * fVar217;
          fVar264 = fStack_16c * fVar210 - fStack_29c * fVar218;
          auVar75 = maxps(_local_2f8,auVar255);
          bVar48 = fVar257 * fVar257 <=
                   auVar75._0_4_ * auVar75._0_4_ * (fVar263 * fVar263 + fVar206 * fVar206) &&
                   (int)uVar68 < local_58;
          auVar279._0_4_ = -(uint)bVar48;
          bVar49 = fVar259 * fVar259 <=
                   auVar75._4_4_ * auVar75._4_4_ * (fVar207 * fVar207 + fVar211 * fVar211) &&
                   (int)(uVar68 | 1) < iStack_54;
          auVar279._4_4_ = -(uint)bVar49;
          bVar50 = fVar261 * fVar261 <=
                   auVar75._8_4_ * auVar75._8_4_ * (fVar209 * fVar209 + fVar217 * fVar217) &&
                   (int)(uVar68 | 2) < iStack_50;
          auVar279._8_4_ = -(uint)bVar50;
          bVar51 = fVar264 * fVar264 <=
                   auVar75._12_4_ * auVar75._12_4_ * (fVar210 * fVar210 + fVar218 * fVar218) &&
                   (int)(uVar68 | 3) < iStack_4c;
          auVar279._12_4_ = -(uint)bVar51;
          uVar67 = movmskps(SUB84(auVar64,0),auVar279);
          auVar64 = (undefined1  [8])(ulong)uVar67;
          if (uVar67 != 0) {
            _local_208 = auVar255;
            _local_188 = auVar279;
            local_258._4_4_ = fVar211;
            local_258._0_4_ = fVar206;
            fStack_250 = fVar217;
            fStack_24c = fVar218;
            fVar127 = fVar199 * local_368 + fVar169 * local_388 + fVar155 * fVar170 +
                      fVar126 * fVar192;
            fVar129 = fVar205 * fStack_364 + fVar193 * fStack_384 + fVar157 * fVar170 +
                      fVar128 * fVar192;
            fStack_3d0 = fStack_3d0 * fStack_360 + fVar197 * fStack_380 + fVar160 * fVar170 +
                         fVar131 * fVar192;
            fStack_3cc = fStack_3cc * fStack_35c + fVar198 * fStack_37c + fVar168 * fVar170 +
                         fVar143 * fVar192;
            local_3d8 = CONCAT44(fVar129,fVar127);
            local_398._0_4_ = auVar27._0_4_;
            local_398._4_4_ = auVar27._4_4_;
            fStack_390 = auVar27._8_4_;
            local_398._0_4_ =
                 (float)local_398._0_4_ * local_368 + local_348 * local_388 + local_3a8 * fVar170 +
                 local_3b8 * fVar192;
            local_398._4_4_ =
                 (float)local_398._4_4_ * fStack_364 + fStack_344 * fStack_384 +
                 fStack_3a4 * fVar170 + fStack_3b4 * fVar192;
            fStack_390 = fStack_390 * fStack_360 + fStack_340 * fStack_380 + fStack_3a0 * fVar170 +
                         fStack_3b0 * fVar192;
            fStack_38c = fVar138 * fStack_35c + fStack_33c * fStack_37c + fStack_39c * fVar170 +
                         fStack_3ac * fVar192;
            pfVar1 = (float *)(lVar23 + 0x21b457c + lVar65 * 4);
            fVar126 = *pfVar1;
            fVar128 = pfVar1[1];
            fVar131 = pfVar1[2];
            fVar138 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b4a00 + lVar65 * 4);
            fVar143 = *pfVar1;
            fVar155 = pfVar1[1];
            fVar157 = pfVar1[2];
            fVar160 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b4e84 + lVar65 * 4);
            fVar168 = *pfVar1;
            fVar169 = pfVar1[1];
            fVar193 = pfVar1[2];
            fVar197 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b5308 + lVar65 * 4);
            fVar198 = *pfVar1;
            fVar199 = pfVar1[1];
            fVar205 = pfVar1[2];
            fVar257 = pfVar1[3];
            fVar130 = local_1c8 * fVar126 +
                      local_1d8 * fVar143 + fVar140 * fVar168 + local_3c8 * fVar198;
            fVar132 = fStack_1c4 * fVar128 +
                      fStack_1d4 * fVar155 + fVar106 * fVar169 + fStack_3c4 * fVar199;
            fVar139 = fStack_1c0 * fVar131 +
                      fStack_1d0 * fVar157 + fVar107 * fVar193 + fStack_3c0 * fVar205;
            fVar141 = fStack_1bc * fVar138 +
                      fStack_1cc * fVar160 + fVar108 * fVar197 + fStack_3bc * fVar257;
            fVar272 = local_1b8 * fVar126 +
                      local_1e8 * fVar143 + fVar191 * fVar168 + fVar73 * fVar198;
            fVar274 = fStack_1b4 * fVar128 +
                      fStack_1e4 * fVar155 + fVar191 * fVar169 + fVar73 * fVar199;
            fVar276 = fStack_1b0 * fVar131 +
                      fStack_1e0 * fVar157 + fVar191 * fVar193 + fVar73 * fVar205;
            fVar109 = fStack_1ac * fVar138 +
                      fStack_1dc * fVar160 + fVar191 * fVar197 + fVar73 * fVar257;
            pfVar1 = (float *)(lVar23 + 0x21b699c + lVar65 * 4);
            fVar259 = *pfVar1;
            fVar261 = pfVar1[1];
            fVar264 = pfVar1[2];
            fVar271 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b72a4 + lVar65 * 4);
            fVar273 = *pfVar1;
            fVar275 = pfVar1[1];
            fVar226 = pfVar1[2];
            fVar229 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b7728 + lVar65 * 4);
            fVar238 = *pfVar1;
            fVar241 = pfVar1[1];
            fVar244 = pfVar1[2];
            fVar246 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b6e20 + lVar65 * 4);
            fVar258 = *pfVar1;
            fVar260 = pfVar1[1];
            fVar262 = pfVar1[2];
            fVar265 = pfVar1[3];
            fVar142 = local_1c8 * fVar259 +
                      local_1d8 * fVar258 + fVar140 * fVar273 + local_3c8 * fVar238;
            fVar144 = fStack_1c4 * fVar261 +
                      fStack_1d4 * fVar260 + fVar106 * fVar275 + fStack_3c4 * fVar241;
            fVar156 = fStack_1c0 * fVar264 +
                      fStack_1d0 * fVar262 + fVar107 * fVar226 + fStack_3c0 * fVar244;
            fVar158 = fStack_1bc * fVar271 +
                      fStack_1cc * fVar265 + fVar108 * fVar229 + fStack_3bc * fVar246;
            fVar140 = local_1b8 * fVar259 +
                      local_1e8 * fVar258 + fVar191 * fVar273 + fVar73 * fVar238;
            fVar106 = fStack_1b4 * fVar261 +
                      fStack_1e4 * fVar260 + fVar191 * fVar275 + fVar73 * fVar241;
            fVar107 = fStack_1b0 * fVar264 +
                      fStack_1e0 * fVar262 + fVar191 * fVar226 + fVar73 * fVar244;
            fVar108 = fStack_1ac * fVar271 +
                      fStack_1dc * fVar265 + fVar191 * fVar229 + fVar73 * fVar246;
            auVar256._0_8_ = CONCAT44(fVar132,fVar130) & 0x7fffffff7fffffff;
            auVar256._8_4_ = ABS(fVar139);
            auVar256._12_4_ = ABS(fVar141);
            auVar188._0_8_ = CONCAT44(fVar274,fVar272) & 0x7fffffff7fffffff;
            auVar188._8_4_ = ABS(fVar276);
            auVar188._12_4_ = ABS(fVar109);
            auVar75 = maxps(auVar256,auVar188);
            auVar269._0_8_ =
                 CONCAT44(fVar128 * fVar192 +
                          fVar155 * fVar170 + fVar169 * fStack_384 + fVar199 * fStack_364,
                          fVar126 * fVar192 +
                          fVar143 * fVar170 + fVar168 * local_388 + fVar198 * local_368) &
                 0x7fffffff7fffffff;
            auVar269._8_4_ =
                 ABS(fVar131 * fVar192 +
                     fVar157 * fVar170 + fVar193 * fStack_380 + fVar205 * fStack_360);
            auVar269._12_4_ =
                 ABS(fVar138 * fVar192 +
                     fVar160 * fVar170 + fVar197 * fStack_37c + fVar257 * fStack_35c);
            auVar75 = maxps(auVar75,auVar269);
            uVar67 = -(uint)(local_2e8 <= auVar75._0_4_);
            uVar69 = -(uint)(fStack_2e4 <= auVar75._4_4_);
            uVar70 = -(uint)(fStack_2e0 <= auVar75._8_4_);
            uVar71 = -(uint)(fStack_2dc <= auVar75._12_4_);
            auVar189._0_4_ = ~uVar67 & (uint)fVar263;
            auVar189._4_4_ = ~uVar69 & (uint)fVar207;
            auVar189._8_4_ = ~uVar70 & (uint)fVar209;
            auVar189._12_4_ = ~uVar71 & (uint)fVar210;
            auVar235._0_4_ = (uint)fVar130 & uVar67;
            auVar235._4_4_ = (uint)fVar132 & uVar69;
            auVar235._8_4_ = (uint)fVar139 & uVar70;
            auVar235._12_4_ = (uint)fVar141 & uVar71;
            auVar235 = auVar235 | auVar189;
            fVar155 = (float)(~uVar67 & (uint)fVar206 | (uint)fVar272 & uVar67);
            fVar157 = (float)(~uVar69 & (uint)fVar211 | (uint)fVar274 & uVar69);
            fVar160 = (float)(~uVar70 & (uint)fVar217 | (uint)fVar276 & uVar70);
            fVar257 = (float)(~uVar71 & (uint)fVar218 | (uint)fVar109 & uVar71);
            auVar270._0_8_ = CONCAT44(fVar144,fVar142) & 0x7fffffff7fffffff;
            auVar270._8_4_ = ABS(fVar156);
            auVar270._12_4_ = ABS(fVar158);
            auVar135._0_8_ = CONCAT44(fVar106,fVar140) & 0x7fffffff7fffffff;
            auVar135._8_4_ = ABS(fVar107);
            auVar135._12_4_ = ABS(fVar108);
            auVar75 = maxps(auVar270,auVar135);
            auVar102._0_8_ =
                 CONCAT44(fVar261 * fVar192 +
                          fVar260 * fVar170 + fVar275 * fStack_384 + fVar241 * fStack_364,
                          fVar259 * fVar192 +
                          fVar258 * fVar170 + fVar273 * local_388 + fVar238 * local_368) &
                 0x7fffffff7fffffff;
            auVar102._8_4_ =
                 ABS(fVar264 * fVar192 +
                     fVar262 * fVar170 + fVar226 * fStack_380 + fVar244 * fStack_360);
            auVar102._12_4_ =
                 ABS(fVar271 * fVar192 +
                     fVar265 * fVar170 + fVar229 * fStack_37c + fVar246 * fStack_35c);
            auVar75 = maxps(auVar75,auVar102);
            uVar67 = -(uint)(local_2e8 <= auVar75._0_4_);
            uVar69 = -(uint)(fStack_2e4 <= auVar75._4_4_);
            uVar70 = -(uint)(fStack_2e0 <= auVar75._8_4_);
            uVar71 = -(uint)(fStack_2dc <= auVar75._12_4_);
            fVar271 = (float)((uint)fVar142 & uVar67 | ~uVar67 & (uint)fVar263);
            fVar273 = (float)((uint)fVar144 & uVar69 | ~uVar69 & (uint)fVar207);
            fVar275 = (float)((uint)fVar156 & uVar70 | ~uVar70 & (uint)fVar209);
            fVar226 = (float)((uint)fVar158 & uVar71 | ~uVar71 & (uint)fVar210);
            fVar207 = (float)(~uVar67 & (uint)fVar206 | (uint)fVar140 & uVar67);
            fVar211 = (float)(~uVar69 & (uint)fVar211 | (uint)fVar106 & uVar69);
            fVar210 = (float)(~uVar70 & (uint)fVar217 | (uint)fVar107 & uVar70);
            fVar218 = (float)(~uVar71 & (uint)fVar218 | (uint)fVar108 & uVar71);
            fVar143 = auVar235._0_4_;
            fVar140 = auVar235._4_4_;
            fVar106 = auVar235._8_4_;
            fVar107 = auVar235._12_4_;
            auVar164._0_4_ = fVar155 * fVar155 + fVar143 * fVar143;
            auVar164._4_4_ = fVar157 * fVar157 + fVar140 * fVar140;
            auVar164._8_4_ = fVar160 * fVar160 + fVar106 * fVar106;
            auVar164._12_4_ = fVar257 * fVar257 + fVar107 * fVar107;
            auVar75 = rsqrtps(auVar189,auVar164);
            fVar108 = auVar75._0_4_;
            fVar126 = auVar75._4_4_;
            fVar128 = auVar75._8_4_;
            fVar131 = auVar75._12_4_;
            auVar190._0_4_ = fVar108 * fVar108 * auVar164._0_4_ * 0.5 * fVar108;
            auVar190._4_4_ = fVar126 * fVar126 * auVar164._4_4_ * 0.5 * fVar126;
            auVar190._8_4_ = fVar128 * fVar128 * auVar164._8_4_ * 0.5 * fVar128;
            auVar190._12_4_ = fVar131 * fVar131 * auVar164._12_4_ * 0.5 * fVar131;
            fVar138 = fVar108 * 1.5 - auVar190._0_4_;
            fVar198 = fVar126 * 1.5 - auVar190._4_4_;
            fVar199 = fVar128 * 1.5 - auVar190._8_4_;
            fVar205 = fVar131 * 1.5 - auVar190._12_4_;
            auVar165._0_4_ = fVar207 * fVar207 + fVar271 * fVar271;
            auVar165._4_4_ = fVar211 * fVar211 + fVar273 * fVar273;
            auVar165._8_4_ = fVar210 * fVar210 + fVar275 * fVar275;
            auVar165._12_4_ = fVar218 * fVar218 + fVar226 * fVar226;
            auVar75 = rsqrtps(auVar190,auVar165);
            fVar108 = auVar75._0_4_;
            fVar126 = auVar75._4_4_;
            fVar128 = auVar75._8_4_;
            fVar131 = auVar75._12_4_;
            fVar168 = fVar108 * 1.5 - fVar108 * fVar108 * auVar165._0_4_ * 0.5 * fVar108;
            fVar169 = fVar126 * 1.5 - fVar126 * fVar126 * auVar165._4_4_ * 0.5 * fVar126;
            fVar193 = fVar128 * 1.5 - fVar128 * fVar128 * auVar165._8_4_ * 0.5 * fVar128;
            fVar197 = fVar131 * 1.5 - fVar131 * fVar131 * auVar165._12_4_ * 0.5 * fVar131;
            fVar206 = fVar155 * fVar138 * (float)local_2f8._0_4_;
            fVar217 = fVar157 * fVar198 * (float)local_2f8._4_4_;
            fVar263 = fVar160 * fVar199 * fStack_2f0;
            fVar209 = fVar257 * fVar205 * fStack_2ec;
            fVar143 = -fVar143 * fVar138 * (float)local_2f8._0_4_;
            fVar155 = -fVar140 * fVar198 * (float)local_2f8._4_4_;
            fVar157 = -fVar106 * fVar199 * fStack_2f0;
            fVar160 = -fVar107 * fVar205 * fStack_2ec;
            local_348 = local_178 + fVar143;
            fStack_344 = fStack_174 + fVar155;
            fStack_340 = fStack_170 + fVar157;
            fStack_33c = fStack_16c + fVar160;
            fVar257 = fVar138 * 0.0 * (float)local_2f8._0_4_;
            fVar259 = fVar198 * 0.0 * (float)local_2f8._4_4_;
            fVar261 = fVar199 * 0.0 * fStack_2f0;
            fVar264 = fVar205 * 0.0 * fStack_2ec;
            local_3a8 = (float)local_398._0_4_ + fVar257;
            fStack_3a4 = (float)local_398._4_4_ + fVar259;
            fStack_3a0 = fStack_390 + fVar261;
            fStack_39c = fStack_38c + fVar264;
            fVar198 = fVar207 * fVar168 * auVar255._0_4_;
            fVar199 = fVar211 * fVar169 * auVar255._4_4_;
            fVar205 = fVar210 * fVar193 * auVar255._8_4_;
            fVar229 = fVar218 * fVar197 * auVar255._12_4_;
            fVar140 = fVar236 + fVar198;
            fVar106 = fVar239 + fVar199;
            fVar107 = fVar242 + fVar205;
            fVar108 = fVar245 + fVar229;
            fVar126 = -fVar271 * fVar168 * auVar255._0_4_;
            fVar128 = -fVar273 * fVar169 * auVar255._4_4_;
            fVar131 = -fVar275 * fVar193 * auVar255._8_4_;
            fVar138 = -fVar226 * fVar197 * auVar255._12_4_;
            fVar271 = fVar219 + fVar126;
            fVar273 = fVar224 + fVar128;
            fVar275 = fVar225 + fVar131;
            fVar226 = fVar227 + fVar138;
            fVar168 = fVar168 * 0.0 * auVar255._0_4_;
            fVar169 = fVar169 * 0.0 * auVar255._4_4_;
            fVar193 = fVar193 * 0.0 * auVar255._8_4_;
            fVar197 = fVar197 * 0.0 * auVar255._12_4_;
            fVar211 = (float)local_2a8._0_4_ - fVar206;
            fVar218 = (float)local_2a8._4_4_ - fVar217;
            fVar207 = fStack_2a0 - fVar263;
            fVar210 = fStack_29c - fVar209;
            fVar238 = fVar127 + fVar168;
            fVar241 = fVar129 + fVar169;
            fVar244 = fStack_3d0 + fVar193;
            fVar246 = fStack_3cc + fVar197;
            fVar143 = local_178 - fVar143;
            fVar155 = fStack_174 - fVar155;
            fVar157 = fStack_170 - fVar157;
            fVar160 = fStack_16c - fVar160;
            fVar257 = (float)local_398._0_4_ - fVar257;
            fVar259 = (float)local_398._4_4_ - fVar259;
            fVar261 = fStack_390 - fVar261;
            fVar264 = fStack_38c - fVar264;
            uVar67 = -(uint)(0.0 < (fVar143 * (fVar238 - fVar257) - fVar257 * (fVar271 - fVar143)) *
                                   0.0 + (fVar257 * (fVar140 - fVar211) -
                                         (fVar238 - fVar257) * fVar211) * 0.0 +
                                         ((fVar271 - fVar143) * fVar211 -
                                         (fVar140 - fVar211) * fVar143));
            uVar69 = -(uint)(0.0 < (fVar155 * (fVar241 - fVar259) - fVar259 * (fVar273 - fVar155)) *
                                   0.0 + (fVar259 * (fVar106 - fVar218) -
                                         (fVar241 - fVar259) * fVar218) * 0.0 +
                                         ((fVar273 - fVar155) * fVar218 -
                                         (fVar106 - fVar218) * fVar155));
            uVar70 = -(uint)(0.0 < (fVar157 * (fVar244 - fVar261) - fVar261 * (fVar275 - fVar157)) *
                                   0.0 + (fVar261 * (fVar107 - fVar207) -
                                         (fVar244 - fVar261) * fVar207) * 0.0 +
                                         ((fVar275 - fVar157) * fVar207 -
                                         (fVar107 - fVar207) * fVar157));
            uVar71 = -(uint)(0.0 < (fVar160 * (fVar246 - fVar264) - fVar264 * (fVar226 - fVar160)) *
                                   0.0 + (fVar264 * (fVar108 - fVar210) -
                                         (fVar246 - fVar264) * fVar210) * 0.0 +
                                         ((fVar226 - fVar160) * fVar210 -
                                         (fVar108 - fVar210) * fVar160));
            local_3b8 = (float)((uint)(fVar236 - fVar198) & uVar67 |
                               ~uVar67 & (uint)((float)local_2a8._0_4_ + fVar206));
            fStack_3b4 = (float)((uint)(fVar239 - fVar199) & uVar69 |
                                ~uVar69 & (uint)((float)local_2a8._4_4_ + fVar217));
            fStack_3b0 = (float)((uint)(fVar242 - fVar205) & uVar70 |
                                ~uVar70 & (uint)(fStack_2a0 + fVar263));
            fStack_3ac = (float)((uint)(fVar245 - fVar229) & uVar71 |
                                ~uVar71 & (uint)(fStack_29c + fVar209));
            fVar236 = (float)((uint)(fVar219 - fVar126) & uVar67 | ~uVar67 & (uint)local_348);
            fVar224 = (float)((uint)(fVar224 - fVar128) & uVar69 | ~uVar69 & (uint)fStack_344);
            fVar225 = (float)((uint)(fVar225 - fVar131) & uVar70 | ~uVar70 & (uint)fStack_340);
            fVar227 = (float)((uint)(fVar227 - fVar138) & uVar71 | ~uVar71 & (uint)fStack_33c);
            fVar126 = (float)((uint)(fVar127 - fVar168) & uVar67 | ~uVar67 & (uint)local_3a8);
            fVar128 = (float)((uint)(fVar129 - fVar169) & uVar69 | ~uVar69 & (uint)fStack_3a4);
            fVar131 = (float)((uint)(fStack_3d0 - fVar193) & uVar70 | ~uVar70 & (uint)fStack_3a0);
            fVar138 = (float)((uint)(fStack_3cc - fVar197) & uVar71 | ~uVar71 & (uint)fStack_39c);
            fVar217 = (float)((uint)fVar211 & uVar67 | ~uVar67 & (uint)fVar140);
            fVar263 = (float)((uint)fVar218 & uVar69 | ~uVar69 & (uint)fVar106);
            fVar209 = (float)((uint)fVar207 & uVar70 | ~uVar70 & (uint)fVar107);
            fVar219 = (float)((uint)fVar210 & uVar71 | ~uVar71 & (uint)fVar108);
            fVar198 = (float)((uint)fVar143 & uVar67 | ~uVar67 & (uint)fVar271);
            fVar199 = (float)((uint)fVar155 & uVar69 | ~uVar69 & (uint)fVar273);
            fVar205 = (float)((uint)fVar157 & uVar70 | ~uVar70 & (uint)fVar275);
            fVar206 = (float)((uint)fVar160 & uVar71 | ~uVar71 & (uint)fVar226);
            fVar168 = (float)((uint)fVar257 & uVar67 | ~uVar67 & (uint)fVar238);
            fVar169 = (float)((uint)fVar259 & uVar69 | ~uVar69 & (uint)fVar241);
            fVar193 = (float)((uint)fVar261 & uVar70 | ~uVar70 & (uint)fVar244);
            fVar197 = (float)((uint)fVar264 & uVar71 | ~uVar71 & (uint)fVar246);
            fVar239 = (float)((uint)fVar140 & uVar67 | ~uVar67 & (uint)fVar211) - local_3b8;
            fVar242 = (float)((uint)fVar106 & uVar69 | ~uVar69 & (uint)fVar218) - fStack_3b4;
            fVar245 = (float)((uint)fVar107 & uVar70 | ~uVar70 & (uint)fVar207) - fStack_3b0;
            fVar229 = (float)((uint)fVar108 & uVar71 | ~uVar71 & (uint)fVar210) - fStack_3ac;
            fVar211 = (float)((uint)fVar271 & uVar67 | ~uVar67 & (uint)fVar143) - fVar236;
            fVar218 = (float)((uint)fVar273 & uVar69 | ~uVar69 & (uint)fVar155) - fVar224;
            fVar207 = (float)((uint)fVar275 & uVar70 | ~uVar70 & (uint)fVar157) - fVar225;
            fVar210 = (float)((uint)fVar226 & uVar71 | ~uVar71 & (uint)fVar160) - fVar227;
            fVar257 = (float)((uint)fVar238 & uVar67 | ~uVar67 & (uint)fVar257) - fVar126;
            fVar259 = (float)((uint)fVar241 & uVar69 | ~uVar69 & (uint)fVar259) - fVar128;
            fVar261 = (float)((uint)fVar244 & uVar70 | ~uVar70 & (uint)fVar261) - fVar131;
            fVar264 = (float)((uint)fVar246 & uVar71 | ~uVar71 & (uint)fVar264) - fVar138;
            fVar238 = local_3b8 - fVar217;
            fVar241 = fStack_3b4 - fVar263;
            fVar244 = fStack_3b0 - fVar209;
            fVar246 = fStack_3ac - fVar219;
            fVar140 = fVar236 - fVar198;
            fVar106 = fVar224 - fVar199;
            fVar107 = fVar225 - fVar205;
            fVar108 = fVar227 - fVar206;
            fVar143 = fVar126 - fVar168;
            fVar155 = fVar128 - fVar169;
            fVar157 = fVar131 - fVar193;
            fVar160 = fVar138 - fVar197;
            fVar271 = (fVar236 * fVar257 - fVar126 * fVar211) * 0.0 +
                      (fVar126 * fVar239 - local_3b8 * fVar257) * 0.0 +
                      (local_3b8 * fVar211 - fVar236 * fVar239);
            fVar273 = (fVar224 * fVar259 - fVar128 * fVar218) * 0.0 +
                      (fVar128 * fVar242 - fStack_3b4 * fVar259) * 0.0 +
                      (fStack_3b4 * fVar218 - fVar224 * fVar242);
            auVar153._4_4_ = fVar273;
            auVar153._0_4_ = fVar271;
            fVar275 = (fVar225 * fVar261 - fVar131 * fVar207) * 0.0 +
                      (fVar131 * fVar245 - fStack_3b0 * fVar261) * 0.0 +
                      (fStack_3b0 * fVar207 - fVar225 * fVar245);
            fVar226 = (fVar227 * fVar264 - fVar138 * fVar210) * 0.0 +
                      (fVar138 * fVar229 - fStack_3ac * fVar264) * 0.0 +
                      (fStack_3ac * fVar210 - fVar227 * fVar229);
            auVar280._0_4_ =
                 (fVar198 * fVar143 - fVar168 * fVar140) * 0.0 +
                 (fVar168 * fVar238 - fVar217 * fVar143) * 0.0 +
                 (fVar217 * fVar140 - fVar198 * fVar238);
            auVar280._4_4_ =
                 (fVar199 * fVar155 - fVar169 * fVar106) * 0.0 +
                 (fVar169 * fVar241 - fVar263 * fVar155) * 0.0 +
                 (fVar263 * fVar106 - fVar199 * fVar241);
            auVar280._8_4_ =
                 (fVar205 * fVar157 - fVar193 * fVar107) * 0.0 +
                 (fVar193 * fVar244 - fVar209 * fVar157) * 0.0 +
                 (fVar209 * fVar107 - fVar205 * fVar244);
            auVar280._12_4_ =
                 (fVar206 * fVar160 - fVar197 * fVar108) * 0.0 +
                 (fVar197 * fVar246 - fVar219 * fVar160) * 0.0 +
                 (fVar219 * fVar108 - fVar206 * fVar246);
            auVar153._8_4_ = fVar275;
            auVar153._12_4_ = fVar226;
            auVar75 = maxps(auVar153,auVar280);
            bVar48 = auVar75._0_4_ <= 0.0 && bVar48;
            auVar154._0_4_ = -(uint)bVar48;
            bVar49 = auVar75._4_4_ <= 0.0 && bVar49;
            auVar154._4_4_ = -(uint)bVar49;
            bVar50 = auVar75._8_4_ <= 0.0 && bVar50;
            auVar154._8_4_ = -(uint)bVar50;
            bVar51 = auVar75._12_4_ <= 0.0 && bVar51;
            auVar154._12_4_ = -(uint)bVar51;
            iVar53 = movmskps((int)(catmullrom_basis1 + lVar23),auVar154);
            if (iVar53 == 0) {
LAB_00b48bb6:
              auVar137._8_8_ = uStack_300;
              auVar137._0_8_ = local_308;
            }
            else {
              fVar168 = ray->tfar;
              fVar169 = fVar140 * fVar257 - fVar143 * fVar211;
              fVar193 = fVar106 * fVar259 - fVar155 * fVar218;
              fVar197 = fVar107 * fVar261 - fVar157 * fVar207;
              fVar198 = fVar108 * fVar264 - fVar160 * fVar210;
              fVar143 = fVar143 * fVar239 - fVar257 * fVar238;
              fVar155 = fVar155 * fVar242 - fVar259 * fVar241;
              fVar157 = fVar157 * fVar245 - fVar261 * fVar244;
              fVar160 = fVar160 * fVar229 - fVar264 * fVar246;
              fVar199 = fVar238 * fVar211 - fVar140 * fVar239;
              fVar205 = fVar241 * fVar218 - fVar106 * fVar242;
              fVar206 = fVar244 * fVar207 - fVar107 * fVar245;
              fVar211 = fVar246 * fVar210 - fVar108 * fVar229;
              auVar136._0_4_ = fVar143 * 0.0 + fVar199;
              auVar136._4_4_ = fVar155 * 0.0 + fVar205;
              auVar136._8_4_ = fVar157 * 0.0 + fVar206;
              auVar136._12_4_ = fVar160 * 0.0 + fVar211;
              auVar196._0_4_ = fVar169 * 0.0 + auVar136._0_4_;
              auVar196._4_4_ = fVar193 * 0.0 + auVar136._4_4_;
              auVar196._8_4_ = fVar197 * 0.0 + auVar136._8_4_;
              auVar196._12_4_ = fVar198 * 0.0 + auVar136._12_4_;
              auVar75 = rcpps(auVar136,auVar196);
              fVar140 = auVar75._0_4_;
              fVar106 = auVar75._4_4_;
              fVar107 = auVar75._8_4_;
              fVar108 = auVar75._12_4_;
              fVar140 = (1.0 - auVar196._0_4_ * fVar140) * fVar140 + fVar140;
              fVar106 = (1.0 - auVar196._4_4_ * fVar106) * fVar106 + fVar106;
              fVar107 = (1.0 - auVar196._8_4_ * fVar107) * fVar107 + fVar107;
              fVar108 = (1.0 - auVar196._12_4_ * fVar108) * fVar108 + fVar108;
              fVar126 = (fVar126 * fVar199 + fVar236 * fVar143 + local_3b8 * fVar169) * fVar140;
              fVar128 = (fVar128 * fVar205 + fVar224 * fVar155 + fStack_3b4 * fVar193) * fVar106;
              fVar131 = (fVar131 * fVar206 + fVar225 * fVar157 + fStack_3b0 * fVar197) * fVar107;
              fVar138 = (fVar138 * fVar211 + fVar227 * fVar160 + fStack_3ac * fVar198) * fVar108;
              bVar48 = (local_1f8 <= fVar126 && fVar126 <= fVar168) && bVar48;
              auVar166._0_4_ = -(uint)bVar48;
              bVar49 = (fStack_1f4 <= fVar128 && fVar128 <= fVar168) && bVar49;
              auVar166._4_4_ = -(uint)bVar49;
              bVar50 = (fStack_1f0 <= fVar131 && fVar131 <= fVar168) && bVar50;
              auVar166._8_4_ = -(uint)bVar50;
              bVar51 = (fStack_1ec <= fVar138 && fVar138 <= fVar168) && bVar51;
              auVar166._12_4_ = -(uint)bVar51;
              iVar53 = movmskps(iVar53,auVar166);
              if (iVar53 == 0) goto LAB_00b48bb6;
              auVar167._0_8_ =
                   CONCAT44(-(uint)(auVar196._4_4_ != 0.0 && bVar49),
                            -(uint)(auVar196._0_4_ != 0.0 && bVar48));
              auVar167._8_4_ = -(uint)(auVar196._8_4_ != 0.0 && bVar50);
              auVar167._12_4_ = -(uint)(auVar196._12_4_ != 0.0 && bVar51);
              iVar53 = movmskps(iVar53,auVar167);
              auVar137._8_8_ = uStack_300;
              auVar137._0_8_ = local_308;
              if (iVar53 != 0) {
                fVar271 = fVar271 * fVar140;
                fVar273 = fVar273 * fVar106;
                fVar275 = fVar275 * fVar107;
                fVar226 = fVar226 * fVar108;
                local_3e8 = (float)((uint)(1.0 - fVar271) & uVar67 | ~uVar67 & (uint)fVar271);
                fStack_3e4 = (float)((uint)(1.0 - fVar273) & uVar69 | ~uVar69 & (uint)fVar273);
                fStack_3e0 = (float)((uint)(1.0 - fVar275) & uVar70 | ~uVar70 & (uint)fVar275);
                fStack_3dc = (float)((uint)(1.0 - fVar226) & uVar71 | ~uVar71 & (uint)fVar226);
                local_1a8 = (float)(~uVar67 & (uint)(auVar280._0_4_ * fVar140) |
                                   (uint)(1.0 - auVar280._0_4_ * fVar140) & uVar67);
                fStack_1a4 = (float)(~uVar69 & (uint)(auVar280._4_4_ * fVar106) |
                                    (uint)(1.0 - auVar280._4_4_ * fVar106) & uVar69);
                fStack_1a0 = (float)(~uVar70 & (uint)(auVar280._8_4_ * fVar107) |
                                    (uint)(1.0 - auVar280._8_4_ * fVar107) & uVar70);
                fStack_19c = (float)(~uVar71 & (uint)(auVar280._12_4_ * fVar108) |
                                    (uint)(1.0 - auVar280._12_4_ * fVar108) & uVar71);
                auVar137._8_4_ = auVar167._8_4_;
                auVar137._0_8_ = auVar167._0_8_;
                auVar137._12_4_ = auVar167._12_4_;
                local_3f8 = fVar126;
                fStack_3f4 = fVar128;
                fStack_3f0 = fVar131;
                fStack_3ec = fVar138;
              }
            }
            iVar53 = movmskps(iVar53,auVar137);
            fVar140 = local_358;
            fVar106 = fStack_354;
            fVar107 = fStack_350;
            fVar108 = fStack_34c;
            if (iVar53 != 0) {
              fVar128 = (auVar255._0_4_ - (float)local_2f8._0_4_) * local_3e8 +
                        (float)local_2f8._0_4_;
              fVar131 = (auVar255._4_4_ - (float)local_2f8._4_4_) * fStack_3e4 +
                        (float)local_2f8._4_4_;
              fVar138 = (auVar255._8_4_ - fStack_2f0) * fStack_3e0 + fStack_2f0;
              fVar143 = (auVar255._12_4_ - fStack_2ec) * fStack_3dc + fStack_2ec;
              fVar126 = local_310->depth_scale;
              auVar103._0_4_ = -(uint)(fVar126 * (fVar128 + fVar128) < local_3f8) & auVar137._0_4_;
              auVar103._4_4_ = -(uint)(fVar126 * (fVar131 + fVar131) < fStack_3f4) & auVar137._4_4_;
              auVar103._8_4_ = -(uint)(fVar126 * (fVar138 + fVar138) < fStack_3f0) & auVar137._8_4_;
              auVar103._12_4_ =
                   -(uint)(fVar126 * (fVar143 + fVar143) < fStack_3ec) & auVar137._12_4_;
              uVar67 = movmskps((int)local_310,auVar103);
              if (uVar67 != 0) {
                local_1a8 = local_1a8 + local_1a8 + -1.0;
                fStack_1a4 = fStack_1a4 + fStack_1a4 + -1.0;
                fStack_1a0 = fStack_1a0 + fStack_1a0 + -1.0;
                fStack_19c = fStack_19c + fStack_19c + -1.0;
                local_128 = local_3e8;
                fStack_124 = fStack_3e4;
                fStack_120 = fStack_3e0;
                fStack_11c = fStack_3dc;
                local_118 = local_1a8;
                fStack_114 = fStack_1a4;
                fStack_110 = fStack_1a0;
                fStack_10c = fStack_19c;
                local_108 = local_3f8;
                fStack_104 = fStack_3f4;
                fStack_100 = fStack_3f0;
                fStack_fc = fStack_3ec;
                local_f8 = uVar68;
                local_f4 = iVar19;
                local_e8 = CONCAT44(fStack_224,local_228);
                uStack_e0 = CONCAT44(fStack_21c,fStack_220);
                local_d8 = CONCAT44(fStack_234,local_238);
                uStack_d0 = CONCAT44(fStack_22c,fStack_230);
                local_c8 = CONCAT44(fStack_244,local_248);
                uStack_c0 = CONCAT44(fStack_23c,fStack_240);
                local_b8 = CONCAT44(fStack_214,local_218);
                uStack_b0 = CONCAT44(fStack_20c,fStack_210);
                local_a8 = auVar103;
                auVar64 = (undefined1  [8])(context->scene->geometries).items[local_318].ptr;
                if ((((Geometry *)auVar64)->mask & ray->mask) == 0) {
                  puVar60 = (undefined1 *)0x0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (puVar60 = (undefined1 *)CONCAT71((int7)((ulong)context->args >> 8),1),
                        ((Geometry *)auVar64)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar140 = (float)(int)uVar68;
                  local_98[0] = (fVar140 + local_3e8 + 0.0) * local_68;
                  local_98[1] = (fVar140 + fStack_3e4 + 1.0) * fStack_64;
                  local_98[2] = (fVar140 + fStack_3e0 + 2.0) * fStack_60;
                  local_98[3] = (fVar140 + fStack_3dc + 3.0) * fStack_5c;
                  local_88 = CONCAT44(fStack_1a4,local_1a8);
                  uStack_80 = CONCAT44(fStack_19c,fStack_1a0);
                  local_78[0] = local_3f8;
                  local_78[1] = fStack_3f4;
                  local_78[2] = fStack_3f0;
                  local_78[3] = fStack_3ec;
                  local_458 = (ulong)(uVar67 & 0xff);
                  uVar55 = 0;
                  if (local_458 != 0) {
                    for (; ((uVar67 & 0xff) >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                    }
                  }
                  local_3b8 = ray->tfar;
                  local_398 = auVar64;
                  do {
                    local_28c = local_98[uVar55];
                    local_288 = *(undefined4 *)((long)&local_88 + uVar55 * 4);
                    local_3d8 = uVar55;
                    ray->tfar = local_78[uVar55];
                    fVar140 = 1.0 - local_28c;
                    fVar107 = local_28c * 3.0;
                    fVar108 = ((fVar107 + 2.0) * (fVar140 + fVar140) + fVar140 * -3.0 * fVar140) *
                              0.5;
                    fVar106 = (fVar140 * -2.0 * local_28c + local_28c * local_28c) * 0.5;
                    fVar107 = (local_28c * fVar107 + (fVar107 + -5.0) * (local_28c + local_28c)) *
                              0.5;
                    fVar140 = (local_28c * (fVar140 + fVar140) - fVar140 * fVar140) * 0.5;
                    local_2d8._16_8_ = context->user;
                    local_298 = (RTCFilterFunctionN)
                                CONCAT44(fVar140 * fStack_224 +
                                         fVar107 * fStack_234 +
                                         fVar108 * fStack_244 + fVar106 * fStack_214,
                                         fVar140 * local_228 +
                                         fVar107 * local_238 +
                                         fVar108 * local_248 + fVar106 * local_218);
                    local_290 = fVar140 * fStack_220 +
                                fVar107 * fStack_230 + fVar108 * fStack_240 + fVar106 * fStack_210;
                    local_284 = (int)local_260;
                    local_280 = (int)local_318;
                    local_27c = *(uint *)&(((Device *)local_2d8._16_8_)->super_State).super_RefCount
                                          ._vptr_RefCount;
                    local_278 = *(uint *)((long)&(((Device *)local_2d8._16_8_)->super_State).
                                                 super_RefCount._vptr_RefCount + 4);
                    local_3fc = -1;
                    local_2d8._0_8_ = &local_3fc;
                    local_2d8._8_8_ = ((Geometry *)auVar64)->userPtr;
                    local_2d8._24_8_ = ray;
                    local_2d8._32_8_ = &local_298;
                    local_2b0 = 1.4013e-45;
                    pp_Var52 = &((Geometry *)auVar64)->occlusionFilterN;
                    if (*pp_Var52 == (RTCFilterFunctionN)0x0) {
LAB_00b48aaf:
                      pRVar58 = context->args;
                      auVar61 = (undefined1  [8])pRVar58;
                      if ((pRVar58->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar58->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (auVar61 = local_398,
                          ((ulong)((RTCIntersectArguments *)((long)local_398 + 0x20))->intersect &
                          0x40000000000000) != 0)))) {
                        auVar64 = (undefined1  [8])local_2d8;
                        (*pRVar58->filter)((RTCFilterFunctionNArguments *)auVar64);
                        if (*(int *)local_2d8._0_8_ == 0) goto LAB_00b48af7;
                      }
                      puVar60 = (undefined1 *)CONCAT71((int7)((ulong)auVar61 >> 8),1);
                      ray = local_370;
                      break;
                    }
                    auVar64 = (undefined1  [8])local_2d8;
                    (**pp_Var52)((RTCFilterFunctionNArguments *)auVar64);
                    if (*(int *)local_2d8._0_8_ != 0) goto LAB_00b48aaf;
LAB_00b48af7:
                    local_370->tfar = local_3b8;
                    local_458 = local_458 ^ 1L << (local_3d8 & 0x3f);
                    uVar55 = 0;
                    if (local_458 != 0) {
                      for (; (local_458 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                      }
                    }
                    puVar60 = (undefined1 *)0x0;
                    ray = local_370;
                    auVar64 = local_398;
                  } while (local_458 != 0);
                }
                bVar63 = (bool)(bVar63 | (byte)puVar60);
                fVar140 = local_358;
                fVar106 = fStack_354;
                fVar107 = fStack_350;
                fVar108 = fStack_34c;
              }
            }
          }
          uVar56 = SUB84(puVar60,0);
          lVar65 = lVar65 + 4;
        } while ((int)lVar65 < iVar19);
      }
      if (bVar63 != false) {
        return bVar63;
      }
      fVar140 = ray->tfar;
      auVar125._4_4_ = -(uint)(fStack_44 <= fVar140);
      auVar125._0_4_ = -(uint)(local_48 <= fVar140);
      auVar125._8_4_ = -(uint)(fStack_40 <= fVar140);
      auVar125._12_4_ = -(uint)(fStack_3c <= fVar140);
      uVar67 = movmskps(uVar56,auVar125);
      uVar66 = uVar66 & uVar66 + 0xf & uVar67;
    } while (uVar66 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }